

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# innerproduct_x86_fma.cpp
# Opt level: O2

int __thiscall
ncnn::InnerProduct_x86_fma::forward_fp16s
          (InnerProduct_x86_fma *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  undefined8 *puVar1;
  undefined4 uVar2;
  uint uVar3;
  float fVar4;
  float fVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  uint uVar11;
  _func_int *p_Var12;
  int *piVar13;
  long lVar14;
  void *pvVar15;
  size_t sVar16;
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [16];
  ulong uVar24;
  uint uVar25;
  long lVar26;
  int iVar27;
  ulong uVar28;
  undefined1 (*pauVar29) [32];
  undefined1 (*pauVar30) [32];
  long lVar31;
  long lVar32;
  int iVar33;
  long lVar34;
  undefined1 (*pauVar35) [16];
  int iVar36;
  long lVar37;
  undefined1 (*pauVar38) [16];
  long lVar39;
  long lVar40;
  undefined1 (*pauVar41) [16];
  long lVar42;
  undefined1 (*pauVar43) [16];
  ulong uVar44;
  long lVar45;
  long lVar46;
  unsigned_short *puVar47;
  float fVar48;
  undefined1 auVar49 [16];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar62 [32];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Db_02;
  undefined4 extraout_XMM0_Db_03;
  undefined4 extraout_XMM0_Db_04;
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar67 [32];
  undefined4 extraout_XMM0_Db_05;
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  float fVar69;
  undefined4 extraout_XMM0_Dc;
  undefined1 auVar68 [64];
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dc_01;
  undefined4 extraout_XMM0_Dc_02;
  undefined4 extraout_XMM0_Dc_03;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  undefined4 extraout_XMM0_Dd_01;
  undefined4 extraout_XMM0_Dd_02;
  undefined4 extraout_XMM0_Dd_03;
  undefined1 extraout_var [60];
  undefined4 extraout_XMM0_Dc_04;
  undefined4 extraout_XMM0_Dd_04;
  undefined1 extraout_var_00 [60];
  undefined1 extraout_var_01 [60];
  __m128 pos;
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar89 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  __m128 pos_1;
  undefined1 auVar109 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar108 [16];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar110 [16];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar120 [16];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  float fVar161;
  undefined1 auVar181 [16];
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  undefined1 auVar184 [32];
  undefined1 auVar185 [32];
  undefined1 auVar186 [32];
  undefined1 auVar187 [32];
  undefined1 auVar188 [32];
  undefined1 auVar189 [32];
  undefined1 auVar190 [32];
  undefined1 auVar191 [32];
  undefined1 auVar192 [32];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [32];
  undefined1 auVar211 [32];
  undefined1 auVar212 [32];
  undefined1 auVar213 [32];
  undefined1 auVar203 [16];
  undefined1 auVar214 [32];
  undefined1 auVar215 [32];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [32];
  undefined1 auVar229 [32];
  undefined1 auVar230 [32];
  undefined1 auVar231 [32];
  undefined1 auVar232 [32];
  undefined1 auVar233 [32];
  undefined1 auVar234 [32];
  undefined1 auVar235 [32];
  undefined1 auVar236 [32];
  undefined1 auVar237 [32];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar238 [32];
  undefined1 auVar239 [32];
  undefined1 auVar240 [32];
  undefined1 auVar241 [32];
  undefined1 auVar242 [32];
  undefined1 auVar243 [32];
  undefined1 auVar244 [32];
  undefined1 auVar245 [32];
  undefined1 auVar246 [32];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [32];
  undefined1 auVar262 [32];
  undefined1 auVar263 [32];
  undefined1 auVar264 [32];
  undefined1 auVar265 [32];
  undefined1 auVar266 [32];
  undefined1 auVar267 [32];
  undefined1 auVar268 [32];
  undefined1 auVar269 [32];
  undefined1 auVar270 [32];
  undefined1 auVar271 [32];
  undefined1 auVar272 [32];
  undefined1 auVar273 [32];
  undefined1 auVar274 [32];
  undefined1 auVar275 [32];
  undefined1 auVar276 [32];
  undefined1 auVar277 [32];
  undefined1 auVar278 [32];
  undefined1 auVar279 [32];
  undefined1 auVar280 [32];
  undefined1 auVar281 [32];
  undefined1 auVar282 [32];
  undefined1 auVar283 [32];
  undefined1 auVar284 [32];
  undefined1 auVar285 [32];
  undefined1 auVar286 [32];
  undefined1 auVar287 [32];
  undefined1 auVar288 [32];
  undefined1 auVar289 [32];
  undefined1 auVar290 [32];
  undefined1 auVar291 [32];
  undefined1 auVar292 [32];
  undefined1 auVar293 [64];
  undefined1 auVar295 [16];
  undefined1 auVar296 [16];
  undefined1 auVar297 [16];
  undefined1 auVar298 [16];
  undefined1 auVar299 [16];
  undefined1 auVar300 [16];
  undefined1 auVar301 [32];
  undefined1 auVar302 [32];
  undefined1 auVar303 [32];
  undefined1 auVar294 [16];
  undefined1 auVar304 [32];
  undefined1 auVar305 [16];
  undefined1 auVar306 [16];
  undefined1 auVar307 [16];
  undefined1 auVar308 [16];
  undefined1 auVar309 [16];
  undefined1 auVar310 [16];
  undefined1 auVar311 [32];
  undefined1 auVar312 [32];
  undefined1 auVar313 [32];
  undefined1 auVar314 [32];
  undefined1 auVar315 [16];
  undefined1 auVar316 [16];
  undefined1 auVar317 [16];
  undefined1 auVar318 [16];
  undefined1 auVar319 [16];
  undefined1 auVar320 [16];
  undefined1 auVar321 [16];
  undefined1 auVar322 [16];
  undefined1 auVar323 [16];
  undefined1 auVar324 [32];
  undefined1 auVar325 [32];
  undefined1 auVar326 [32];
  undefined1 auVar327 [32];
  undefined1 auVar328 [32];
  undefined1 auVar329 [16];
  undefined1 auVar330 [16];
  undefined1 auVar331 [16];
  undefined1 auVar332 [32];
  undefined1 auVar333 [32];
  undefined1 auVar334 [16];
  undefined1 auVar335 [16];
  undefined1 auVar336 [32];
  undefined1 auVar337 [32];
  undefined1 auVar338 [32];
  undefined1 auVar339 [16];
  undefined1 auVar340 [16];
  undefined1 auVar341 [32];
  undefined1 auVar342 [32];
  undefined1 auVar343 [32];
  undefined1 auVar344 [32];
  undefined1 auVar345 [64];
  undefined1 auVar346 [16];
  undefined1 auVar347 [16];
  undefined1 auVar348 [32];
  undefined1 auVar349 [32];
  undefined1 auVar350 [32];
  undefined1 auVar351 [64];
  undefined1 auVar352 [16];
  undefined1 auVar353 [16];
  undefined1 auVar354 [32];
  undefined1 auVar355 [32];
  undefined1 auVar356 [64];
  undefined1 auVar357 [16];
  undefined1 auVar358 [16];
  undefined1 auVar359 [32];
  undefined1 auVar360 [32];
  undefined1 auVar361 [64];
  undefined1 (*local_318) [32];
  int *piStack_310;
  size_t local_308;
  int local_300;
  Allocator *local_2f8;
  int local_2f0;
  int local_2ec;
  undefined8 local_2e8;
  int local_2e0;
  size_t local_2d8;
  undefined1 local_2c8 [16];
  undefined8 local_2b8;
  undefined1 local_2a8 [16];
  undefined1 local_298 [16];
  undefined1 local_288 [16];
  undefined1 local_278 [16];
  undefined1 local_268 [16];
  float local_258;
  undefined1 local_248 [16];
  float local_238;
  undefined4 uStack_234;
  undefined4 uStack_230;
  undefined4 uStack_22c;
  undefined1 local_228 [32];
  undefined1 local_208 [32];
  undefined1 local_1e8 [32];
  ulong local_1c0;
  undefined1 local_1b8 [32];
  undefined1 local_198 [32];
  undefined1 local_178 [32];
  undefined1 local_158 [32];
  undefined1 local_138 [32];
  undefined1 local_118 [32];
  undefined1 local_f8 [32];
  undefined1 local_d8 [32];
  undefined1 local_b8 [32];
  undefined1 local_98 [32];
  Option opt_flatten;
  undefined1 auVar58 [32];
  undefined1 auVar61 [32];
  undefined1 auVar66 [32];
  undefined1 auVar88 [32];
  undefined1 auVar90 [32];
  undefined1 auVar100 [32];
  
  local_2f0 = bottom_blob->dims;
  if (local_2f0 == 2) {
    local_2ec = bottom_blob->w;
    if (local_2ec ==
        *(int *)(&this->field_0xd8 + (long)this->_vptr_InnerProduct_x86_fma[-3]) /
        *(int *)(&this->field_0xd0 + (long)this->_vptr_InnerProduct_x86_fma[-3])) {
      Mat::create(top_blob,*(int *)(&this->field_0xd0 + (long)this->_vptr_InnerProduct_x86_fma[-3]),
                  bottom_blob->h,bottom_blob->elemsize,bottom_blob->elempack,opt->blob_allocator);
      if (top_blob->data == (void *)0x0) {
        return -100;
      }
      if ((long)top_blob->c * top_blob->cstep == 0) {
        return -100;
      }
      p_Var12 = this->_vptr_InnerProduct_x86_fma[-3];
      innerproduct_gemm_fp16s_sse
                (bottom_blob,top_blob,&this->weight_data_tm,
                 (Mat *)(&this->field_0x178 + (long)p_Var12),
                 *(int *)(&this->field_0xe0 + (long)p_Var12),
                 (Mat *)(&this->field_0xe8 + (long)p_Var12),opt);
      return 0;
    }
  }
  else {
    local_2ec = bottom_blob->w;
  }
  piVar13 = bottom_blob->refcount;
  local_318 = (undefined1 (*) [32])bottom_blob->data;
  piStack_310 = bottom_blob->refcount;
  local_308 = bottom_blob->elemsize;
  local_300 = bottom_blob->elempack;
  local_2f8 = bottom_blob->allocator;
  local_2e8._0_4_ = bottom_blob->h;
  local_2e8._4_4_ = bottom_blob->d;
  local_2e0 = bottom_blob->c;
  local_2d8 = bottom_blob->cstep;
  iVar27 = local_2f0;
  if (piVar13 != (int *)0x0) {
    LOCK();
    *piVar13 = *piVar13 + 1;
    UNLOCK();
    iVar27 = bottom_blob->dims;
  }
  if (iVar27 != 1) {
    opt_flatten.lightmode = opt->lightmode;
    opt_flatten._1_3_ = *(undefined3 *)&opt->field_0x1;
    opt_flatten.num_threads = opt->num_threads;
    opt_flatten.workspace_allocator = opt->workspace_allocator;
    opt_flatten.openmp_blocktime = opt->openmp_blocktime;
    opt_flatten.use_winograd_convolution = opt->use_winograd_convolution;
    opt_flatten.use_sgemm_convolution = opt->use_sgemm_convolution;
    opt_flatten.use_int8_inference = opt->use_int8_inference;
    opt_flatten.use_vulkan_compute = opt->use_vulkan_compute;
    opt_flatten.use_bf16_storage = opt->use_bf16_storage;
    opt_flatten.use_fp16_packed = opt->use_fp16_packed;
    opt_flatten.use_fp16_storage = opt->use_fp16_storage;
    opt_flatten.use_fp16_arithmetic = opt->use_fp16_arithmetic;
    opt_flatten.use_int8_packed = opt->use_int8_packed;
    opt_flatten.use_int8_storage = opt->use_int8_storage;
    opt_flatten.use_int8_arithmetic = opt->use_int8_arithmetic;
    opt_flatten.use_packing_layout = opt->use_packing_layout;
    opt_flatten.use_shader_pack8 = opt->use_shader_pack8;
    opt_flatten.use_subgroup_basic = opt->use_subgroup_basic;
    opt_flatten.use_subgroup_vote = opt->use_subgroup_vote;
    opt_flatten.use_subgroup_ballot = opt->use_subgroup_ballot;
    opt_flatten.use_subgroup_shuffle = opt->use_subgroup_shuffle;
    opt_flatten.use_image_storage = opt->use_image_storage;
    opt_flatten.use_tensor_storage = opt->use_tensor_storage;
    opt_flatten.use_reserved_0 = opt->use_reserved_0;
    opt_flatten.flush_denormals = opt->flush_denormals;
    opt_flatten.use_local_pool_allocator = opt->use_local_pool_allocator;
    opt_flatten.use_shader_local_memory = opt->use_shader_local_memory;
    opt_flatten.use_cooperative_matrix = opt->use_cooperative_matrix;
    opt_flatten.use_winograd23_convolution = opt->use_winograd23_convolution;
    opt_flatten.use_winograd43_convolution = opt->use_winograd43_convolution;
    opt_flatten.use_winograd63_convolution = opt->use_winograd63_convolution;
    opt_flatten.use_a53_a55_optimized_kernel = opt->use_a53_a55_optimized_kernel;
    opt_flatten.use_reserved_7 = opt->use_reserved_7;
    opt_flatten.use_reserved_8 = opt->use_reserved_8;
    opt_flatten.use_reserved_9 = opt->use_reserved_9;
    opt_flatten.use_reserved_10 = opt->use_reserved_10;
    opt_flatten.use_reserved_11 = opt->use_reserved_11;
    opt_flatten.blob_allocator = opt->workspace_allocator;
    (*this->flatten->_vptr_Layer[7])(this->flatten,bottom_blob,&local_318);
  }
  uVar11 = *(uint *)(&this->field_0xd0 + (long)this->_vptr_InnerProduct_x86_fma[-3]);
  if (opt->use_packing_layout == true) {
    uVar25 = 8;
    if ((uVar11 & 7) != 0) {
      uVar25 = (uint)((uVar11 & 3) == 0) * 3 + 1;
    }
  }
  else {
    uVar25 = 1;
  }
  Mat::create(top_blob,(int)uVar11 / (int)uVar25,
              (ulong)uVar25 * (local_308 / (ulong)(long)local_300),uVar25,opt->blob_allocator);
  iVar27 = -100;
  if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
    p_Var12 = this->_vptr_InnerProduct_x86_fma[-3];
    iVar27 = *(int *)(&this->field_0xe0 + (long)p_Var12);
    iVar33 = local_300 * local_2ec;
    iVar36 = top_blob->elempack;
    uVar11 = top_blob->w;
    lVar14 = *(long *)(&this->field_0x178 + (long)p_Var12);
    if (iVar36 == 1) {
      uVar44 = 0;
      local_1c0 = (ulong)(uint)((int)uVar11 >> 3);
      if ((int)uVar11 >> 3 < 1) {
        local_1c0 = uVar44;
      }
      lVar34 = 1;
      lVar39 = 2;
      lVar37 = 3;
      lVar40 = 4;
      lVar42 = 5;
      lVar45 = 6;
      lVar32 = 7;
      for (uVar28 = 0; pauVar30 = local_318, uVar28 != local_1c0; uVar28 = uVar28 + 1) {
        auVar71 = ZEXT816(0) << 0x40;
        local_228._8_8_ = 0;
        local_228._0_8_ = 0;
        local_228._16_8_ = 0;
        local_228._24_8_ = 0;
        if (lVar14 != 0) {
          puVar1 = (undefined8 *)(lVar14 + uVar28 * 0x20);
          local_228._0_8_ = *puVar1;
          local_228._8_8_ = puVar1[1];
          local_228._16_8_ = puVar1[2];
          local_228._24_8_ = puVar1[3];
        }
        pvVar15 = (this->weight_data_tm).data;
        sVar16 = (this->weight_data_tm).elemsize;
        lVar26 = (long)(this->weight_data_tm).w;
        lVar31 = 0;
        lVar46 = 0;
        auVar108 = ZEXT816(0) << 0x40;
        auVar73 = ZEXT816(0) << 0x40;
        auVar77 = ZEXT816(0) << 0x40;
        auVar197 = ZEXT816(0) << 0x40;
        auVar109 = ZEXT816(0) << 0x40;
        local_1e8._0_16_ = ZEXT816(0);
        local_208._0_16_ = ZEXT816(0);
        iVar36 = 0;
        while( true ) {
          local_1e8 = ZEXT1632(local_1e8._0_16_);
          local_208 = ZEXT1632(local_208._0_16_);
          auVar361 = ZEXT1664(auVar109);
          auVar356 = ZEXT1664(auVar197);
          auVar351 = ZEXT1664(auVar77);
          auVar345 = ZEXT1664(auVar73);
          auVar293 = ZEXT1664(auVar108);
          auVar68 = ZEXT1664(auVar71);
          local_98 = ZEXT1632(auVar109);
          local_1b8 = ZEXT1632(auVar197);
          local_198 = ZEXT1632(auVar77);
          local_178 = ZEXT1632(auVar73);
          local_158 = ZEXT1632(auVar108);
          local_138 = ZEXT1632(auVar71);
          if (iVar33 <= iVar36 + 7) break;
          auVar63 = *(undefined1 (*) [32])(*local_318 + lVar46 * 2);
          auVar71 = vlddqu_avx(*(undefined1 (*) [16])
                                ((long)pvVar15 + lVar46 + sVar16 * uVar44 * lVar26));
          auVar109 = vlddqu_avx(*(undefined1 (*) [16])
                                 ((long)pvVar15 + lVar46 + sVar16 * lVar34 * lVar26));
          auVar197 = vlddqu_avx(*(undefined1 (*) [16])
                                 ((long)pvVar15 + lVar46 + sVar16 * lVar39 * lVar26));
          auVar77 = vlddqu_avx(*(undefined1 (*) [16])
                                ((long)pvVar15 + lVar46 + sVar16 * lVar37 * lVar26));
          auVar73 = vlddqu_avx(*(undefined1 (*) [16])
                                ((long)pvVar15 + lVar46 + sVar16 * lVar40 * lVar26));
          auVar108 = vlddqu_avx(*(undefined1 (*) [16])
                                 ((long)pvVar15 + lVar46 + sVar16 * lVar42 * lVar26));
          auVar53 = vlddqu_avx(*(undefined1 (*) [16])
                                ((long)pvVar15 + lVar46 + sVar16 * lVar45 * lVar26));
          auVar120 = vlddqu_avx(*(undefined1 (*) [16])
                                 ((long)pvVar15 + lVar46 + sVar16 * lVar32 * lVar26));
          auVar60 = vcvtph2ps_f16c(auVar71);
          local_208._0_16_ = vfmadd231ps_fma(local_208,auVar63,auVar60);
          auVar60 = vcvtph2ps_f16c(auVar109);
          local_1e8._0_16_ = vfmadd231ps_fma(local_1e8,auVar63,auVar60);
          auVar60 = vcvtph2ps_f16c(auVar197);
          auVar109 = vfmadd231ps_fma(local_98,auVar63,auVar60);
          auVar60 = vcvtph2ps_f16c(auVar77);
          auVar197 = vfmadd231ps_fma(local_1b8,auVar63,auVar60);
          auVar60 = vcvtph2ps_f16c(auVar73);
          auVar107 = vcvtph2ps_f16c(auVar108);
          auVar64 = vcvtph2ps_f16c(auVar53);
          auVar159 = vcvtph2ps_f16c(auVar120);
          auVar77 = vfmadd231ps_fma(local_198,auVar63,auVar60);
          auVar73 = vfmadd231ps_fma(local_178,auVar63,auVar107);
          auVar108 = vfmadd231ps_fma(local_158,auVar63,auVar64);
          auVar71 = vfmadd231ps_fma(local_138,auVar63,auVar159);
          iVar36 = iVar36 + 8;
          lVar46 = lVar46 + 0x10;
          lVar31 = lVar31 + 8;
        }
        lVar26 = sVar16 * lVar26;
        auVar63 = local_228;
        for (; (int)lVar31 < iVar33; lVar31 = lVar31 + 1) {
          puVar47 = (unsigned_short *)((long)pvVar15 + lVar31 * 2 + lVar26 * uVar44);
          uVar25 = *(uint *)(*pauVar30 + lVar31 * 4);
          local_228 = auVar63;
          local_238 = float16_to_float32(*puVar47);
          local_248 = ZEXT416(*(uint *)(*pauVar30 + lVar31 * 4));
          uStack_234 = extraout_XMM0_Db;
          uStack_230 = extraout_XMM0_Dc;
          uStack_22c = extraout_XMM0_Dd;
          local_258 = float16_to_float32(*(unsigned_short *)((long)puVar47 + lVar26));
          local_268 = ZEXT416(*(uint *)(*pauVar30 + lVar31 * 4));
          fVar48 = float16_to_float32(puVar47[lVar26]);
          auVar63 = local_b8;
          local_b8._4_4_ = extraout_XMM0_Db_00;
          local_b8._0_4_ = fVar48;
          local_b8._8_4_ = extraout_XMM0_Dc_00;
          local_b8._16_16_ = auVar63._16_16_;
          local_b8._12_4_ = extraout_XMM0_Dd_00;
          local_d8._0_16_ = ZEXT416(*(uint *)(*pauVar30 + lVar31 * 4));
          fVar48 = float16_to_float32(*(unsigned_short *)((long)puVar47 + lVar26 * 3));
          auVar63 = local_f8;
          local_f8._4_4_ = extraout_XMM0_Db_01;
          local_f8._0_4_ = fVar48;
          local_f8._8_4_ = extraout_XMM0_Dc_01;
          local_f8._16_16_ = auVar63._16_16_;
          local_f8._12_4_ = extraout_XMM0_Dd_01;
          local_118._0_16_ = ZEXT416(*(uint *)(*pauVar30 + lVar31 * 4));
          local_278._0_4_ = float16_to_float32(puVar47[lVar26 * 2]);
          local_278._4_4_ = extraout_XMM0_Db_02;
          local_278._8_4_ = extraout_XMM0_Dc_02;
          local_278._12_4_ = extraout_XMM0_Dd_02;
          local_288 = ZEXT416(*(uint *)(*pauVar30 + lVar31 * 4));
          local_298._0_4_ = float16_to_float32(*(unsigned_short *)((long)puVar47 + lVar26 * 5));
          local_298._4_4_ = extraout_XMM0_Db_03;
          local_298._8_4_ = extraout_XMM0_Dc_03;
          local_298._12_4_ = extraout_XMM0_Dd_03;
          local_2a8 = ZEXT416(*(uint *)(*pauVar30 + lVar31 * 4));
          fVar48 = float16_to_float32(puVar47[lVar26 * 3]);
          local_2b8 = CONCAT44(extraout_XMM0_Db_04,fVar48);
          local_2c8 = ZEXT416(*(uint *)(*pauVar30 + lVar31 * 4));
          auVar68._0_4_ = float16_to_float32(*(unsigned_short *)((long)puVar47 + lVar26 * 7));
          auVar68._4_60_ = extraout_var;
          auVar71 = vinsertps_avx(local_278,ZEXT416((uint)local_298._0_4_),0x10);
          auVar71 = vinsertps_avx(auVar71,ZEXT416((uint)local_2b8),0x20);
          auVar71 = vinsertps_avx(auVar71,auVar68._0_16_,0x30);
          auVar109._4_4_ = uStack_234;
          auVar109._0_4_ = local_238;
          auVar109._8_4_ = uStack_230;
          auVar109._12_4_ = uStack_22c;
          auVar109 = vinsertps_avx(auVar109,ZEXT416((uint)local_258),0x10);
          auVar109 = vinsertps_avx(auVar109,ZEXT416((uint)local_b8._0_4_),0x20);
          auVar109 = vinsertps_avx(auVar109,ZEXT416((uint)local_f8._0_4_),0x30);
          auVar63._16_16_ = auVar71;
          auVar63._0_16_ = auVar109;
          auVar71 = vinsertps_avx(local_118._0_16_,ZEXT416((uint)local_288._0_4_),0x10);
          auVar71 = vinsertps_avx(auVar71,ZEXT416((uint)local_2a8._0_4_),0x20);
          auVar71 = vinsertps_avx(auVar71,ZEXT416((uint)local_2c8._0_4_),0x30);
          auVar109 = vinsertps_avx(ZEXT416(uVar25),ZEXT416((uint)local_248._0_4_),0x10);
          auVar109 = vinsertps_avx(auVar109,ZEXT416((uint)local_268._0_4_),0x20);
          auVar109 = vinsertps_avx(auVar109,ZEXT416((uint)local_d8._0_4_),0x30);
          auVar60._16_16_ = auVar71;
          auVar60._0_16_ = auVar109;
          auVar71 = vfmadd231ps_fma(local_228,auVar63,auVar60);
          auVar63 = ZEXT1632(auVar71);
          auVar68 = ZEXT3264(local_138);
          auVar293 = ZEXT3264(local_158);
          auVar345 = ZEXT3264(local_178);
          auVar351 = ZEXT3264(local_198);
          auVar356 = ZEXT3264(local_1b8);
          auVar361 = ZEXT3264(local_98);
        }
        auVar60 = vhaddps_avx(local_208,local_1e8);
        auVar107 = vhaddps_avx(auVar361._0_32_,auVar356._0_32_);
        auVar107 = vhaddps_avx(auVar60,auVar107);
        auVar60 = vhaddps_avx(auVar351._0_32_,auVar345._0_32_);
        auVar64 = vhaddps_avx(auVar293._0_32_,auVar68._0_32_);
        auVar64 = vhaddps_avx(auVar60,auVar64);
        auVar60 = vblendps_avx(auVar107,auVar64,0xf0);
        auVar107 = vperm2f128_avx(auVar107,auVar64,0x21);
        fVar48 = auVar107._0_4_ + auVar63._0_4_ + auVar60._0_4_;
        fVar69 = auVar107._4_4_ + auVar63._4_4_ + auVar60._4_4_;
        auVar64._0_8_ = CONCAT44(fVar69,fVar48);
        auVar64._8_4_ = auVar107._8_4_ + auVar63._8_4_ + auVar60._8_4_;
        auVar64._12_4_ = auVar107._12_4_ + auVar63._12_4_ + auVar60._12_4_;
        auVar64._16_4_ = auVar107._16_4_ + auVar63._16_4_ + auVar60._16_4_;
        auVar64._20_4_ = auVar107._20_4_ + auVar63._20_4_ + auVar60._20_4_;
        auVar64._24_4_ = auVar107._24_4_ + auVar63._24_4_ + auVar60._24_4_;
        auVar64._28_4_ = auVar107._28_4_ + auVar63._28_4_ + auVar60._28_4_;
        auVar63 = auVar64;
        if (5 < iVar27 - 1U) goto switchD_002aef45_caseD_1;
        auVar63 = vmaxps_avx(auVar64,ZEXT832(0) << 0x20);
        switch(iVar27) {
        case 2:
          auVar60 = vminps_avx(auVar64,ZEXT832(0) << 0x20);
          uVar2 = **(undefined4 **)(&this->field_0xe8 + (long)p_Var12);
          auVar149._4_4_ = uVar2;
          auVar149._0_4_ = uVar2;
          auVar149._8_4_ = uVar2;
          auVar149._12_4_ = uVar2;
          auVar149._16_4_ = uVar2;
          auVar149._20_4_ = uVar2;
          auVar149._24_4_ = uVar2;
          auVar149._28_4_ = uVar2;
          auVar71 = vfmadd231ps_fma(auVar63,auVar60,auVar149);
          auVar63 = ZEXT1632(auVar71);
          break;
        case 3:
          uVar2 = **(undefined4 **)(&this->field_0xe8 + (long)p_Var12);
          auVar102._4_4_ = uVar2;
          auVar102._0_4_ = uVar2;
          auVar102._8_4_ = uVar2;
          auVar102._12_4_ = uVar2;
          auVar102._16_4_ = uVar2;
          auVar102._20_4_ = uVar2;
          auVar102._24_4_ = uVar2;
          auVar102._28_4_ = uVar2;
          uVar2 = (*(undefined4 **)(&this->field_0xe8 + (long)p_Var12))[1];
          auVar156._4_4_ = uVar2;
          auVar156._0_4_ = uVar2;
          auVar156._8_4_ = uVar2;
          auVar156._12_4_ = uVar2;
          auVar156._16_4_ = uVar2;
          auVar156._20_4_ = uVar2;
          auVar156._24_4_ = uVar2;
          auVar156._28_4_ = uVar2;
          auVar63 = vmaxps_avx(auVar64,auVar102);
          auVar63 = vminps_avx(auVar63,auVar156);
          break;
        case 4:
          auVar65._0_8_ = auVar64._0_8_ ^ 0x8000000080000000;
          auVar65._8_4_ = -auVar64._8_4_;
          auVar65._12_4_ = -auVar64._12_4_;
          auVar65._16_4_ = -auVar64._16_4_;
          auVar65._20_4_ = -auVar64._20_4_;
          auVar65._24_4_ = -auVar64._24_4_;
          auVar65._28_4_ = -auVar64._28_4_;
          auVar103._8_4_ = 0x42b0c0a5;
          auVar103._0_8_ = 0x42b0c0a542b0c0a5;
          auVar103._12_4_ = 0x42b0c0a5;
          auVar103._16_4_ = 0x42b0c0a5;
          auVar103._20_4_ = 0x42b0c0a5;
          auVar103._24_4_ = 0x42b0c0a5;
          auVar103._28_4_ = 0x42b0c0a5;
          auVar63 = vminps_avx(auVar65,auVar103);
          auVar104._8_4_ = 0xc2b0c0a5;
          auVar104._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar104._12_4_ = 0xc2b0c0a5;
          auVar104._16_4_ = 0xc2b0c0a5;
          auVar104._20_4_ = 0xc2b0c0a5;
          auVar104._24_4_ = 0xc2b0c0a5;
          auVar104._28_4_ = 0xc2b0c0a5;
          auVar60 = vmaxps_avx(auVar63,auVar104);
          auVar105._8_4_ = 0x3fb8aa3b;
          auVar105._0_8_ = 0x3fb8aa3b3fb8aa3b;
          auVar105._12_4_ = 0x3fb8aa3b;
          auVar105._16_4_ = 0x3fb8aa3b;
          auVar105._20_4_ = 0x3fb8aa3b;
          auVar105._24_4_ = 0x3fb8aa3b;
          auVar105._28_4_ = 0x3fb8aa3b;
          auVar215._8_4_ = 0x3f000000;
          auVar215._0_8_ = 0x3f0000003f000000;
          auVar215._12_4_ = 0x3f000000;
          auVar215._16_4_ = 0x3f000000;
          auVar215._20_4_ = 0x3f000000;
          auVar215._24_4_ = 0x3f000000;
          auVar215._28_4_ = 0x3f000000;
          auVar71 = vfmadd213ps_fma(auVar105,auVar60,auVar215);
          auVar107 = vroundps_avx(ZEXT1632(auVar71),1);
          auVar63 = vcmpps_avx(ZEXT1632(auVar71),auVar107,1);
          auVar246._8_4_ = 0x3f800000;
          auVar246._0_8_ = 0x3f8000003f800000;
          auVar246._12_4_ = 0x3f800000;
          auVar246._16_4_ = 0x3f800000;
          auVar246._20_4_ = 0x3f800000;
          auVar246._24_4_ = 0x3f800000;
          auVar246._28_4_ = 0x3f800000;
          auVar63 = vandps_avx(auVar63,auVar246);
          auVar63 = vsubps_avx(auVar107,auVar63);
          auVar157._8_4_ = 0x3f318000;
          auVar157._0_8_ = 0x3f3180003f318000;
          auVar157._12_4_ = 0x3f318000;
          auVar157._16_4_ = 0x3f318000;
          auVar157._20_4_ = 0x3f318000;
          auVar157._24_4_ = 0x3f318000;
          auVar157._28_4_ = 0x3f318000;
          auVar71 = vfmsub231ps_fma(auVar60,auVar63,auVar157);
          auVar158._8_4_ = 0x395e8083;
          auVar158._0_8_ = 0x395e8083395e8083;
          auVar158._12_4_ = 0x395e8083;
          auVar158._16_4_ = 0x395e8083;
          auVar158._20_4_ = 0x395e8083;
          auVar158._24_4_ = 0x395e8083;
          auVar158._28_4_ = 0x395e8083;
          auVar109 = vfmsub231ps_fma(ZEXT1632(auVar71),auVar63,auVar158);
          auVar60 = ZEXT1632(auVar109);
          auVar22._28_4_ = 0x395e8083;
          auVar22._0_28_ =
               ZEXT1628(CONCAT412(auVar109._12_4_ * auVar109._12_4_,
                                  CONCAT48(auVar109._8_4_ * auVar109._8_4_,
                                           CONCAT44(auVar109._4_4_ * auVar109._4_4_,
                                                    auVar109._0_4_ * auVar109._0_4_))));
          auVar192._8_4_ = 0x39506967;
          auVar192._0_8_ = 0x3950696739506967;
          auVar192._12_4_ = 0x39506967;
          auVar192._16_4_ = 0x39506967;
          auVar192._20_4_ = 0x39506967;
          auVar192._24_4_ = 0x39506967;
          auVar192._28_4_ = 0x39506967;
          auVar289._8_4_ = 0x3ab743ce;
          auVar289._0_8_ = 0x3ab743ce3ab743ce;
          auVar289._12_4_ = 0x3ab743ce;
          auVar289._16_4_ = 0x3ab743ce;
          auVar289._20_4_ = 0x3ab743ce;
          auVar289._24_4_ = 0x3ab743ce;
          auVar289._28_4_ = 0x3ab743ce;
          auVar71 = vfmadd213ps_fma(auVar192,auVar60,auVar289);
          auVar290._8_4_ = 0x3c088908;
          auVar290._0_8_ = 0x3c0889083c088908;
          auVar290._12_4_ = 0x3c088908;
          auVar290._16_4_ = 0x3c088908;
          auVar290._20_4_ = 0x3c088908;
          auVar290._24_4_ = 0x3c088908;
          auVar290._28_4_ = 0x3c088908;
          auVar71 = vfmadd213ps_fma(ZEXT1632(auVar71),auVar60,auVar290);
          auVar291._8_4_ = 0x3d2aa9c1;
          auVar291._0_8_ = 0x3d2aa9c13d2aa9c1;
          auVar291._12_4_ = 0x3d2aa9c1;
          auVar291._16_4_ = 0x3d2aa9c1;
          auVar291._20_4_ = 0x3d2aa9c1;
          auVar291._24_4_ = 0x3d2aa9c1;
          auVar291._28_4_ = 0x3d2aa9c1;
          auVar71 = vfmadd213ps_fma(ZEXT1632(auVar71),auVar60,auVar291);
          auVar292._8_4_ = 0x3e2aaaaa;
          auVar292._0_8_ = 0x3e2aaaaa3e2aaaaa;
          auVar292._12_4_ = 0x3e2aaaaa;
          auVar292._16_4_ = 0x3e2aaaaa;
          auVar292._20_4_ = 0x3e2aaaaa;
          auVar292._24_4_ = 0x3e2aaaaa;
          auVar292._28_4_ = 0x3e2aaaaa;
          auVar60 = ZEXT1632(auVar109);
          auVar71 = vfmadd213ps_fma(ZEXT1632(auVar71),auVar60,auVar292);
          auVar71 = vfmadd213ps_fma(ZEXT1632(auVar71),auVar60,auVar215);
          auVar197 = vfmadd213ps_fma(ZEXT1632(auVar71),auVar22,auVar60);
          auVar53._0_4_ = (int)auVar63._0_4_;
          auVar53._4_4_ = (int)auVar63._4_4_;
          auVar53._8_4_ = (int)auVar63._8_4_;
          auVar53._12_4_ = (int)auVar63._12_4_;
          auVar66._16_4_ = (int)auVar63._16_4_;
          auVar66._0_16_ = auVar53;
          auVar66._20_4_ = (int)auVar63._20_4_;
          auVar66._24_4_ = (int)auVar63._24_4_;
          auVar66._28_4_ = (int)auVar63._28_4_;
          auVar109 = vpslld_avx(auVar53,0x17);
          auVar71 = vpslld_avx(auVar66._16_16_,0x17);
          auVar120._8_4_ = 0x3f800000;
          auVar120._0_8_ = 0x3f8000003f800000;
          auVar120._12_4_ = 0x3f800000;
          auVar71 = vpaddd_avx(auVar71,auVar120);
          auVar109 = vpaddd_avx(auVar109,auVar120);
          auVar106._16_16_ = auVar71;
          auVar106._0_16_ = auVar109;
          auVar67._0_4_ = auVar197._0_4_ + 1.0;
          auVar67._4_4_ = auVar197._4_4_ + 1.0;
          auVar67._8_4_ = auVar197._8_4_ + 1.0;
          auVar67._12_4_ = auVar197._12_4_ + 1.0;
          auVar67._16_4_ = 0x3f800000;
          auVar67._20_4_ = 0x3f800000;
          auVar67._24_4_ = 0x3f800000;
          auVar67._28_4_ = 0x3f800000;
          auVar71 = vfmadd213ps_fma(auVar106,auVar67,auVar246);
          auVar63 = vrcpps_avx(ZEXT1632(auVar71));
          auVar71 = vfmsub213ps_fma(ZEXT1632(auVar71),auVar63,auVar246);
          auVar71 = vfnmadd132ps_fma(ZEXT1632(auVar71),auVar63,auVar63);
          auVar63 = ZEXT1632(auVar71);
          break;
        case 5:
          auVar313._8_4_ = 0x42b0c0a5;
          auVar313._0_8_ = 0x42b0c0a542b0c0a5;
          auVar313._12_4_ = 0x42b0c0a5;
          auVar313._16_4_ = 0x42b0c0a5;
          auVar313._20_4_ = 0x42b0c0a5;
          auVar313._24_4_ = 0x42b0c0a5;
          auVar313._28_4_ = 0x42b0c0a5;
          auVar63 = vminps_avx(auVar313,auVar64);
          auVar327._8_4_ = 0xc2b0c0a5;
          auVar327._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar327._12_4_ = 0xc2b0c0a5;
          auVar327._16_4_ = 0xc2b0c0a5;
          auVar327._20_4_ = 0xc2b0c0a5;
          auVar327._24_4_ = 0xc2b0c0a5;
          auVar327._28_4_ = 0xc2b0c0a5;
          auVar60 = vmaxps_avx(auVar327,auVar63);
          auVar338._8_4_ = 0x3fb8aa3b;
          auVar338._0_8_ = 0x3fb8aa3b3fb8aa3b;
          auVar338._12_4_ = 0x3fb8aa3b;
          auVar338._16_4_ = 0x3fb8aa3b;
          auVar338._20_4_ = 0x3fb8aa3b;
          auVar338._24_4_ = 0x3fb8aa3b;
          auVar338._28_4_ = 0x3fb8aa3b;
          auVar333._8_4_ = 0x3f000000;
          auVar333._0_8_ = 0x3f0000003f000000;
          auVar333._12_4_ = 0x3f000000;
          auVar333._16_4_ = 0x3f000000;
          auVar333._20_4_ = 0x3f000000;
          auVar333._24_4_ = 0x3f000000;
          auVar333._28_4_ = 0x3f000000;
          auVar71 = vfmadd213ps_fma(auVar338,auVar60,auVar333);
          auVar107 = vroundps_avx(ZEXT1632(auVar71),1);
          auVar63 = vcmpps_avx(ZEXT1632(auVar71),auVar107,1);
          auVar344._8_4_ = 0x3f800000;
          auVar344._0_8_ = 0x3f8000003f800000;
          auVar344._12_4_ = 0x3f800000;
          auVar344._16_4_ = 0x3f800000;
          auVar344._20_4_ = 0x3f800000;
          auVar344._24_4_ = 0x3f800000;
          auVar344._28_4_ = 0x3f800000;
          auVar63 = vandps_avx(auVar344,auVar63);
          auVar63 = vsubps_avx(auVar107,auVar63);
          auVar350._8_4_ = 0x3f318000;
          auVar350._0_8_ = 0x3f3180003f318000;
          auVar350._12_4_ = 0x3f318000;
          auVar350._16_4_ = 0x3f318000;
          auVar350._20_4_ = 0x3f318000;
          auVar350._24_4_ = 0x3f318000;
          auVar350._28_4_ = 0x3f318000;
          auVar71 = vfmsub231ps_fma(auVar60,auVar63,auVar350);
          auVar314._8_4_ = 0xb95e8083;
          auVar314._0_8_ = 0xb95e8083b95e8083;
          auVar314._12_4_ = 0xb95e8083;
          auVar314._16_4_ = 0xb95e8083;
          auVar314._20_4_ = 0xb95e8083;
          auVar314._24_4_ = 0xb95e8083;
          auVar314._28_4_ = 0xb95e8083;
          auVar109 = vfnmsub231ps_fma(ZEXT1632(auVar71),auVar63,auVar314);
          auVar60 = ZEXT1632(auVar109);
          auVar20._28_4_ = auVar107._28_4_;
          auVar20._0_28_ =
               ZEXT1628(CONCAT412(auVar109._12_4_ * auVar109._12_4_,
                                  CONCAT48(auVar109._8_4_ * auVar109._8_4_,
                                           CONCAT44(auVar109._4_4_ * auVar109._4_4_,
                                                    auVar109._0_4_ * auVar109._0_4_))));
          auVar360._8_4_ = 0x39506967;
          auVar360._0_8_ = 0x3950696739506967;
          auVar360._12_4_ = 0x39506967;
          auVar360._16_4_ = 0x39506967;
          auVar360._20_4_ = 0x39506967;
          auVar360._24_4_ = 0x39506967;
          auVar360._28_4_ = 0x39506967;
          auVar355._8_4_ = 0x3ab743ce;
          auVar355._0_8_ = 0x3ab743ce3ab743ce;
          auVar355._12_4_ = 0x3ab743ce;
          auVar355._16_4_ = 0x3ab743ce;
          auVar355._20_4_ = 0x3ab743ce;
          auVar355._24_4_ = 0x3ab743ce;
          auVar355._28_4_ = 0x3ab743ce;
          auVar71 = vfmadd213ps_fma(auVar360,auVar60,auVar355);
          auVar238._8_4_ = 0x3c088908;
          auVar238._0_8_ = 0x3c0889083c088908;
          auVar238._12_4_ = 0x3c088908;
          auVar238._16_4_ = 0x3c088908;
          auVar238._20_4_ = 0x3c088908;
          auVar238._24_4_ = 0x3c088908;
          auVar238._28_4_ = 0x3c088908;
          auVar71 = vfmadd213ps_fma(ZEXT1632(auVar71),auVar60,auVar238);
          auVar239._8_4_ = 0x3d2aa9c1;
          auVar239._0_8_ = 0x3d2aa9c13d2aa9c1;
          auVar239._12_4_ = 0x3d2aa9c1;
          auVar239._16_4_ = 0x3d2aa9c1;
          auVar239._20_4_ = 0x3d2aa9c1;
          auVar239._24_4_ = 0x3d2aa9c1;
          auVar239._28_4_ = 0x3d2aa9c1;
          auVar71 = vfmadd213ps_fma(ZEXT1632(auVar71),auVar60,auVar239);
          auVar240._8_4_ = 0x3e2aaaaa;
          auVar240._0_8_ = 0x3e2aaaaa3e2aaaaa;
          auVar240._12_4_ = 0x3e2aaaaa;
          auVar240._16_4_ = 0x3e2aaaaa;
          auVar240._20_4_ = 0x3e2aaaaa;
          auVar240._24_4_ = 0x3e2aaaaa;
          auVar240._28_4_ = 0x3e2aaaaa;
          auVar60 = ZEXT1632(auVar109);
          auVar71 = vfmadd213ps_fma(ZEXT1632(auVar71),auVar60,auVar240);
          auVar71 = vfmadd213ps_fma(ZEXT1632(auVar71),auVar60,auVar333);
          auVar71 = vfmadd213ps_fma(ZEXT1632(auVar71),auVar20,auVar60);
          auVar189._0_4_ = auVar71._0_4_ + 1.0;
          auVar189._4_4_ = auVar71._4_4_ + 1.0;
          auVar189._8_4_ = auVar71._8_4_ + 1.0;
          auVar189._12_4_ = auVar71._12_4_ + 1.0;
          auVar189._16_4_ = 0x3f800000;
          auVar189._20_4_ = 0x3f800000;
          auVar189._24_4_ = 0x3f800000;
          auVar189._28_4_ = 0x3f800000;
          auVar71._0_4_ = (int)auVar63._0_4_;
          auVar71._4_4_ = (int)auVar63._4_4_;
          auVar71._8_4_ = (int)auVar63._8_4_;
          auVar71._12_4_ = (int)auVar63._12_4_;
          auVar98._16_4_ = (int)auVar63._16_4_;
          auVar98._0_16_ = auVar71;
          auVar98._20_4_ = (int)auVar63._20_4_;
          auVar98._24_4_ = (int)auVar63._24_4_;
          auVar98._28_4_ = (int)auVar63._28_4_;
          auVar109 = vpslld_avx(auVar71,0x17);
          auVar71 = vpslld_avx(auVar98._16_16_,0x17);
          auVar108._8_4_ = 0x3f800000;
          auVar108._0_8_ = 0x3f8000003f800000;
          auVar108._12_4_ = 0x3f800000;
          auVar71 = vpaddd_avx(auVar71,auVar108);
          auVar109 = vpaddd_avx(auVar109,auVar108);
          auVar99._16_16_ = auVar71;
          auVar99._0_16_ = auVar109;
          auVar197 = vfmadd213ps_fma(auVar99,auVar189,auVar344);
          auVar150._8_4_ = 0x800000;
          auVar150._0_8_ = 0x80000000800000;
          auVar150._12_4_ = 0x800000;
          auVar150._16_4_ = 0x800000;
          auVar150._20_4_ = 0x800000;
          auVar150._24_4_ = 0x800000;
          auVar150._28_4_ = 0x800000;
          auVar63 = vmaxps_avx(ZEXT1632(auVar197),auVar150);
          auVar109 = vpsrld_avx(auVar63._0_16_,0x17);
          auVar71 = vpsrld_avx(auVar63._16_16_,0x17);
          auVar241._8_4_ = 0x807fffff;
          auVar241._0_8_ = 0x807fffff807fffff;
          auVar241._12_4_ = 0x807fffff;
          auVar241._16_4_ = 0x807fffff;
          auVar241._20_4_ = 0x807fffff;
          auVar241._24_4_ = 0x807fffff;
          auVar241._28_4_ = 0x807fffff;
          auVar63 = vandps_avx(auVar63,auVar241);
          auVar107 = vorps_avx(auVar333,auVar63);
          auVar242._8_4_ = 0x3f3504f3;
          auVar242._0_8_ = 0x3f3504f33f3504f3;
          auVar242._12_4_ = 0x3f3504f3;
          auVar242._16_4_ = 0x3f3504f3;
          auVar242._20_4_ = 0x3f3504f3;
          auVar242._24_4_ = 0x3f3504f3;
          auVar242._28_4_ = 0x3f3504f3;
          auVar60 = vcmpps_avx(auVar242,auVar107,2);
          auVar63 = vandnps_avx(auVar60,auVar107);
          auVar328._8_4_ = 0xbf800000;
          auVar328._0_8_ = 0xbf800000bf800000;
          auVar328._12_4_ = 0xbf800000;
          auVar328._16_4_ = 0xbf800000;
          auVar328._20_4_ = 0xbf800000;
          auVar328._24_4_ = 0xbf800000;
          auVar328._28_4_ = 0xbf800000;
          auVar151._0_4_ = auVar107._0_4_ + -1.0 + auVar63._0_4_;
          auVar151._4_4_ = auVar107._4_4_ + -1.0 + auVar63._4_4_;
          auVar151._8_4_ = auVar107._8_4_ + -1.0 + auVar63._8_4_;
          auVar151._12_4_ = auVar107._12_4_ + -1.0 + auVar63._12_4_;
          auVar151._16_4_ = auVar107._16_4_ + -1.0 + auVar63._16_4_;
          auVar151._20_4_ = auVar107._20_4_ + -1.0 + auVar63._20_4_;
          auVar151._24_4_ = auVar107._24_4_ + -1.0 + auVar63._24_4_;
          auVar151._28_4_ = auVar107._28_4_ + -1.0 + auVar63._28_4_;
          auVar71 = vpsubd_avx(auVar71,auVar60._16_16_);
          auVar73._8_4_ = 0xffffff81;
          auVar73._0_8_ = 0xffffff81ffffff81;
          auVar73._12_4_ = 0xffffff81;
          auVar71 = vpaddd_avx(auVar71,auVar73);
          auVar109 = vpsubd_avx(auVar109,auVar60._0_16_);
          auVar109 = vpaddd_avx(auVar109,auVar73);
          auVar190._16_16_ = auVar71;
          auVar190._0_16_ = auVar109;
          auVar214._0_4_ = auVar151._0_4_ * auVar151._0_4_;
          auVar214._4_4_ = auVar151._4_4_ * auVar151._4_4_;
          auVar214._8_4_ = auVar151._8_4_ * auVar151._8_4_;
          auVar214._12_4_ = auVar151._12_4_ * auVar151._12_4_;
          auVar214._16_4_ = auVar151._16_4_ * auVar151._16_4_;
          auVar214._20_4_ = auVar151._20_4_ * auVar151._20_4_;
          auVar214._24_4_ = auVar151._24_4_ * auVar151._24_4_;
          auVar214._28_4_ = 0;
          auVar243._8_4_ = 0x3d9021bb;
          auVar243._0_8_ = 0x3d9021bb3d9021bb;
          auVar243._12_4_ = 0x3d9021bb;
          auVar243._16_4_ = 0x3d9021bb;
          auVar243._20_4_ = 0x3d9021bb;
          auVar243._24_4_ = 0x3d9021bb;
          auVar243._28_4_ = 0x3d9021bb;
          auVar278._8_4_ = 0xbdebd1b8;
          auVar278._0_8_ = 0xbdebd1b8bdebd1b8;
          auVar278._12_4_ = 0xbdebd1b8;
          auVar278._16_4_ = 0xbdebd1b8;
          auVar278._20_4_ = 0xbdebd1b8;
          auVar278._24_4_ = 0xbdebd1b8;
          auVar278._28_4_ = 0xbdebd1b8;
          auVar71 = vfmadd213ps_fma(auVar243,auVar151,auVar278);
          auVar279._8_4_ = 0x3def251a;
          auVar279._0_8_ = 0x3def251a3def251a;
          auVar279._12_4_ = 0x3def251a;
          auVar279._16_4_ = 0x3def251a;
          auVar279._20_4_ = 0x3def251a;
          auVar279._24_4_ = 0x3def251a;
          auVar279._28_4_ = 0x3def251a;
          auVar71 = vfmadd213ps_fma(ZEXT1632(auVar71),auVar151,auVar279);
          auVar280._8_4_ = 0xbdfe5d4f;
          auVar280._0_8_ = 0xbdfe5d4fbdfe5d4f;
          auVar280._12_4_ = 0xbdfe5d4f;
          auVar280._16_4_ = 0xbdfe5d4f;
          auVar280._20_4_ = 0xbdfe5d4f;
          auVar280._24_4_ = 0xbdfe5d4f;
          auVar280._28_4_ = 0xbdfe5d4f;
          auVar71 = vfmadd213ps_fma(ZEXT1632(auVar71),auVar151,auVar280);
          auVar281._8_4_ = 0x3e11e9bf;
          auVar281._0_8_ = 0x3e11e9bf3e11e9bf;
          auVar281._12_4_ = 0x3e11e9bf;
          auVar281._16_4_ = 0x3e11e9bf;
          auVar281._20_4_ = 0x3e11e9bf;
          auVar281._24_4_ = 0x3e11e9bf;
          auVar281._28_4_ = 0x3e11e9bf;
          auVar71 = vfmadd213ps_fma(ZEXT1632(auVar71),auVar151,auVar281);
          auVar282._8_4_ = 0xbe2aae50;
          auVar282._0_8_ = 0xbe2aae50be2aae50;
          auVar282._12_4_ = 0xbe2aae50;
          auVar282._16_4_ = 0xbe2aae50;
          auVar282._20_4_ = 0xbe2aae50;
          auVar282._24_4_ = 0xbe2aae50;
          auVar282._28_4_ = 0xbe2aae50;
          auVar71 = vfmadd213ps_fma(ZEXT1632(auVar71),auVar151,auVar282);
          auVar283._8_4_ = 0x3e4cceac;
          auVar283._0_8_ = 0x3e4cceac3e4cceac;
          auVar283._12_4_ = 0x3e4cceac;
          auVar283._16_4_ = 0x3e4cceac;
          auVar283._20_4_ = 0x3e4cceac;
          auVar283._24_4_ = 0x3e4cceac;
          auVar283._28_4_ = 0x3e4cceac;
          auVar71 = vfmadd213ps_fma(ZEXT1632(auVar71),auVar151,auVar283);
          auVar284._8_4_ = 0xbe7ffffc;
          auVar284._0_8_ = 0xbe7ffffcbe7ffffc;
          auVar284._12_4_ = 0xbe7ffffc;
          auVar284._16_4_ = 0xbe7ffffc;
          auVar284._20_4_ = 0xbe7ffffc;
          auVar284._24_4_ = 0xbe7ffffc;
          auVar284._28_4_ = 0xbe7ffffc;
          auVar71 = vfmadd213ps_fma(ZEXT1632(auVar71),auVar151,auVar284);
          auVar285._8_4_ = 0x3eaaaaaa;
          auVar285._0_8_ = 0x3eaaaaaa3eaaaaaa;
          auVar285._12_4_ = 0x3eaaaaaa;
          auVar285._16_4_ = 0x3eaaaaaa;
          auVar285._20_4_ = 0x3eaaaaaa;
          auVar285._24_4_ = 0x3eaaaaaa;
          auVar285._28_4_ = 0x3eaaaaaa;
          auVar71 = vfmadd213ps_fma(ZEXT1632(auVar71),auVar151,auVar285);
          auVar244._0_4_ = auVar214._0_4_ * auVar151._0_4_ * auVar71._0_4_;
          auVar244._4_4_ = auVar214._4_4_ * auVar151._4_4_ * auVar71._4_4_;
          auVar244._8_4_ = auVar214._8_4_ * auVar151._8_4_ * auVar71._8_4_;
          auVar244._12_4_ = auVar214._12_4_ * auVar151._12_4_ * auVar71._12_4_;
          auVar244._16_4_ = auVar214._16_4_ * auVar151._16_4_ * 0.0;
          auVar244._20_4_ = auVar214._20_4_ * auVar151._20_4_ * 0.0;
          auVar244._24_4_ = auVar214._24_4_ * auVar151._24_4_ * 0.0;
          auVar244._28_4_ = 0;
          auVar60 = vcvtdq2ps_avx(auVar190);
          auVar71 = vfmadd231ps_fma(auVar244,auVar60,auVar314);
          auVar71 = vfmsub231ps_fma(ZEXT1632(auVar71),auVar333,auVar214);
          auVar63 = vcmpps_avx(ZEXT1632(auVar197),_DAT_004efa00,2);
          auVar107 = vsubps_avx(ZEXT1632(auVar71),auVar151);
          auVar71 = vfmsub231ps_fma(auVar107,auVar350,auVar60);
          auVar245._8_4_ = 0xc0000000;
          auVar245._0_8_ = 0xc0000000c0000000;
          auVar245._12_4_ = 0xc0000000;
          auVar245._16_4_ = 0xc0000000;
          auVar245._20_4_ = 0xc0000000;
          auVar245._24_4_ = 0xc0000000;
          auVar245._28_4_ = 0xc0000000;
          auVar152._0_4_ = auVar71._0_4_ * -2.0;
          auVar152._4_4_ = auVar71._4_4_ * -2.0;
          auVar152._8_4_ = auVar71._8_4_ * -2.0;
          auVar152._12_4_ = auVar71._12_4_ * -2.0;
          auVar152._16_4_ = 0x80000000;
          auVar152._20_4_ = 0x80000000;
          auVar152._24_4_ = 0x80000000;
          auVar152._28_4_ = 0;
          auVar191._8_4_ = 0x7fffffff;
          auVar191._0_8_ = 0x7fffffff7fffffff;
          auVar191._12_4_ = 0x7fffffff;
          auVar191._16_4_ = 0x7fffffff;
          auVar191._20_4_ = 0x7fffffff;
          auVar191._24_4_ = 0x7fffffff;
          auVar191._28_4_ = 0x7fffffff;
          auVar63 = vblendvps_avx(auVar152,auVar191,auVar63);
          auVar153._8_4_ = 0x42b0c0a5;
          auVar153._0_8_ = 0x42b0c0a542b0c0a5;
          auVar153._12_4_ = 0x42b0c0a5;
          auVar153._16_4_ = 0x42b0c0a5;
          auVar153._20_4_ = 0x42b0c0a5;
          auVar153._24_4_ = 0x42b0c0a5;
          auVar153._28_4_ = 0x42b0c0a5;
          auVar63 = vminps_avx(auVar63,auVar153);
          auVar154._8_4_ = 0xc2b0c0a5;
          auVar154._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar154._12_4_ = 0xc2b0c0a5;
          auVar154._16_4_ = 0xc2b0c0a5;
          auVar154._20_4_ = 0xc2b0c0a5;
          auVar154._24_4_ = 0xc2b0c0a5;
          auVar154._28_4_ = 0xc2b0c0a5;
          auVar60 = vmaxps_avx(auVar63,auVar154);
          auVar71 = vfmadd213ps_fma(auVar338,auVar60,auVar333);
          auVar107 = vroundps_avx(ZEXT1632(auVar71),1);
          auVar63 = vcmpps_avx(ZEXT1632(auVar71),auVar107,1);
          auVar63 = vandps_avx(auVar344,auVar63);
          auVar63 = vsubps_avx(auVar107,auVar63);
          auVar71 = vfmsub231ps_fma(auVar60,auVar63,auVar350);
          auVar109 = vfnmsub231ps_fma(ZEXT1632(auVar71),auVar63,auVar314);
          auVar60 = ZEXT1632(auVar109);
          auVar21._28_4_ = auVar107._28_4_;
          auVar21._0_28_ =
               ZEXT1628(CONCAT412(auVar109._12_4_ * auVar109._12_4_,
                                  CONCAT48(auVar109._8_4_ * auVar109._8_4_,
                                           CONCAT44(auVar109._4_4_ * auVar109._4_4_,
                                                    auVar109._0_4_ * auVar109._0_4_))));
          auVar71 = vfmadd213ps_fma(auVar360,auVar60,auVar355);
          auVar286._8_4_ = 0x3c088908;
          auVar286._0_8_ = 0x3c0889083c088908;
          auVar286._12_4_ = 0x3c088908;
          auVar286._16_4_ = 0x3c088908;
          auVar286._20_4_ = 0x3c088908;
          auVar286._24_4_ = 0x3c088908;
          auVar286._28_4_ = 0x3c088908;
          auVar71 = vfmadd213ps_fma(ZEXT1632(auVar71),auVar60,auVar286);
          auVar287._8_4_ = 0x3d2aa9c1;
          auVar287._0_8_ = 0x3d2aa9c13d2aa9c1;
          auVar287._12_4_ = 0x3d2aa9c1;
          auVar287._16_4_ = 0x3d2aa9c1;
          auVar287._20_4_ = 0x3d2aa9c1;
          auVar287._24_4_ = 0x3d2aa9c1;
          auVar287._28_4_ = 0x3d2aa9c1;
          auVar71 = vfmadd213ps_fma(ZEXT1632(auVar71),auVar60,auVar287);
          auVar288._8_4_ = 0x3e2aaaaa;
          auVar288._0_8_ = 0x3e2aaaaa3e2aaaaa;
          auVar288._12_4_ = 0x3e2aaaaa;
          auVar288._16_4_ = 0x3e2aaaaa;
          auVar288._20_4_ = 0x3e2aaaaa;
          auVar288._24_4_ = 0x3e2aaaaa;
          auVar288._28_4_ = 0x3e2aaaaa;
          auVar60 = ZEXT1632(auVar109);
          auVar71 = vfmadd213ps_fma(ZEXT1632(auVar71),auVar60,auVar288);
          auVar71 = vfmadd213ps_fma(ZEXT1632(auVar71),auVar60,auVar333);
          auVar197 = vfmadd213ps_fma(ZEXT1632(auVar71),auVar21,auVar60);
          auVar77._0_4_ = (int)auVar63._0_4_;
          auVar77._4_4_ = (int)auVar63._4_4_;
          auVar77._8_4_ = (int)auVar63._8_4_;
          auVar77._12_4_ = (int)auVar63._12_4_;
          auVar100._16_4_ = (int)auVar63._16_4_;
          auVar100._0_16_ = auVar77;
          auVar100._20_4_ = (int)auVar63._20_4_;
          auVar100._24_4_ = (int)auVar63._24_4_;
          auVar100._28_4_ = (int)auVar63._28_4_;
          auVar109 = vpslld_avx(auVar77,0x17);
          auVar71 = vpslld_avx(auVar100._16_16_,0x17);
          auVar71 = vpaddd_avx(auVar71,auVar108);
          auVar109 = vpaddd_avx(auVar109,auVar108);
          auVar101._16_16_ = auVar71;
          auVar101._0_16_ = auVar109;
          auVar155._0_4_ = auVar197._0_4_ + 1.0;
          auVar155._4_4_ = auVar197._4_4_ + 1.0;
          auVar155._8_4_ = auVar197._8_4_ + 1.0;
          auVar155._12_4_ = auVar197._12_4_ + 1.0;
          auVar155._16_4_ = 0x3f800000;
          auVar155._20_4_ = 0x3f800000;
          auVar155._24_4_ = 0x3f800000;
          auVar155._28_4_ = 0x3f800000;
          auVar71 = vfmadd213ps_fma(auVar101,auVar155,auVar344);
          auVar63 = vrcpps_avx(ZEXT1632(auVar71));
          auVar71 = vfmsub213ps_fma(ZEXT1632(auVar71),auVar63,auVar344);
          auVar71 = vfnmadd132ps_fma(ZEXT1632(auVar71),auVar63,auVar63);
          auVar71 = vfnmadd213ps_fma(ZEXT1632(auVar71),auVar245,auVar328);
          auVar68 = ZEXT1664(auVar71);
          goto LAB_002af3b9;
        case 6:
          uVar2 = **(undefined4 **)(&this->field_0xe8 + (long)p_Var12);
          auVar107._4_4_ = uVar2;
          auVar107._0_4_ = uVar2;
          auVar107._8_4_ = uVar2;
          auVar107._12_4_ = uVar2;
          auVar107._16_4_ = uVar2;
          auVar107._20_4_ = uVar2;
          auVar107._24_4_ = uVar2;
          auVar107._28_4_ = uVar2;
          uVar2 = (*(undefined4 **)(&this->field_0xe8 + (long)p_Var12))[1];
          auVar159._4_4_ = uVar2;
          auVar159._0_4_ = uVar2;
          auVar159._8_4_ = uVar2;
          auVar159._12_4_ = uVar2;
          auVar159._16_4_ = uVar2;
          auVar159._20_4_ = uVar2;
          auVar159._24_4_ = uVar2;
          auVar159._28_4_ = uVar2;
          auVar71 = vfmadd231ps_fma(auVar159,auVar64,auVar107);
          auVar63 = vmaxps_avx(ZEXT1632(auVar71),ZEXT832(0) << 0x20);
          auVar160._8_4_ = 0x3f800000;
          auVar160._0_8_ = 0x3f8000003f800000;
          auVar160._12_4_ = 0x3f800000;
          auVar160._16_4_ = 0x3f800000;
          auVar160._20_4_ = 0x3f800000;
          auVar160._24_4_ = 0x3f800000;
          auVar160._28_4_ = 0x3f800000;
          auVar63 = vminps_avx(auVar63,auVar160);
          auVar68 = ZEXT3264(auVar63);
LAB_002af3b9:
          auVar293._0_4_ = auVar68._0_4_ * fVar48;
          auVar293._4_4_ = auVar68._4_4_ * fVar69;
          auVar293._8_4_ = auVar68._8_4_ * auVar64._8_4_;
          auVar293._12_4_ = auVar68._12_4_ * auVar64._12_4_;
          auVar293._16_4_ = auVar68._16_4_ * auVar64._16_4_;
          auVar293._20_4_ = auVar68._20_4_ * auVar64._20_4_;
          auVar293._28_36_ = auVar68._28_36_;
          auVar293._24_4_ = auVar68._24_4_ * auVar64._24_4_;
          auVar63 = auVar293._0_32_;
        }
switchD_002aef45_caseD_1:
        *(undefined1 (*) [32])((long)top_blob->data + uVar28 * 0x20) = auVar63;
        uVar44 = uVar44 + 8;
        lVar34 = lVar34 + 8;
        lVar39 = lVar39 + 8;
        lVar37 = lVar37 + 8;
        lVar40 = lVar40 + 8;
        lVar42 = lVar42 + 8;
        lVar45 = lVar45 + 8;
        lVar32 = lVar32 + 8;
      }
      uVar44 = (long)(int)uVar11 & 0xfffffffffffffff8;
      uVar25 = uVar11 >> 2 & 1;
      lVar34 = uVar44 + 1;
      local_2b8 = uVar44 + 2;
      local_2c8._0_8_ = uVar44 + 3;
      local_1b8._0_8_ = uVar44;
      local_138._0_8_ = uVar44;
      uVar44 = 0;
      while (pauVar30 = local_318, uVar44 != uVar25) {
        uVar28 = local_1b8._0_8_ + uVar44 * 4;
        local_178._0_8_ = uVar44;
        if (lVar14 == 0) {
          auVar71 = ZEXT816(0) << 0x40;
        }
        else {
          auVar71 = *(undefined1 (*) [16])(lVar14 + uVar28 * 4);
        }
        pvVar15 = (this->weight_data_tm).data;
        sVar16 = (this->weight_data_tm).elemsize;
        lVar37 = (long)(this->weight_data_tm).w;
        lVar39 = sVar16 * lVar37;
        local_198._0_8_ = uVar28;
        pauVar43 = (undefined1 (*) [16])(lVar39 * uVar28 + (long)pvVar15);
        pauVar35 = (undefined1 (*) [16])((uVar28 | 1) * lVar39 + (long)pvVar15);
        pauVar38 = (undefined1 (*) [16])((uVar28 | 2) * lVar39 + (long)pvVar15);
        pauVar41 = (undefined1 (*) [16])(lVar39 * (uVar28 | 3) + (long)pvVar15);
        lVar40 = 0;
        auVar109 = ZEXT816(0) << 0x40;
        lVar39 = 0;
        auVar197 = ZEXT816(0) << 0x40;
        auVar77 = ZEXT816(0) << 0x40;
        auVar73 = ZEXT816(0) << 0x40;
        iVar36 = 0;
        pauVar29 = local_318;
        while( true ) {
          auVar351 = ZEXT1664(auVar73);
          auVar345 = ZEXT1664(auVar77);
          auVar293 = ZEXT1664(auVar197);
          auVar68 = ZEXT1664(auVar109);
          local_b8 = ZEXT1632(auVar109);
          local_d8 = ZEXT1632(auVar197);
          local_f8 = ZEXT1632(auVar77);
          local_118 = ZEXT1632(auVar73);
          if (iVar33 <= iVar36 + 7) break;
          auVar63 = *pauVar29;
          auVar109 = vlddqu_avx(*pauVar43);
          auVar60 = vcvtph2ps_f16c(auVar109);
          auVar109 = vlddqu_avx(*pauVar35);
          auVar107 = vcvtph2ps_f16c(auVar109);
          auVar109 = vlddqu_avx(*pauVar38);
          auVar64 = vcvtph2ps_f16c(auVar109);
          auVar109 = vlddqu_avx(*pauVar41);
          auVar159 = vcvtph2ps_f16c(auVar109);
          auVar109 = vfmadd231ps_fma(local_b8,auVar63,auVar60);
          auVar197 = vfmadd231ps_fma(local_d8,auVar63,auVar107);
          auVar77 = vfmadd231ps_fma(local_f8,auVar63,auVar64);
          auVar73 = vfmadd231ps_fma(local_118,auVar63,auVar159);
          pauVar29 = pauVar29 + 1;
          pauVar43 = pauVar43 + 1;
          pauVar35 = pauVar35 + 1;
          pauVar38 = pauVar38 + 1;
          pauVar41 = pauVar41 + 1;
          iVar36 = iVar36 + 8;
          lVar39 = lVar39 + 0x10;
          lVar40 = lVar40 + 8;
        }
        lVar42 = sVar16 * local_138._0_8_ * lVar37;
        local_158._0_8_ = lVar34;
        lVar45 = sVar16 * lVar34 * lVar37;
        lVar34 = sVar16 * local_2b8 * lVar37;
        lVar37 = sVar16 * local_2c8._0_8_ * lVar37;
        local_278 = ZEXT816(0) << 0x40;
        local_288 = ZEXT816(0) << 0x40;
        local_298 = ZEXT816(0) << 0x40;
        local_2a8 = ZEXT816(0) << 0x40;
        for (; iVar36 + 3 < iVar33; iVar36 = iVar36 + 4) {
          auVar197._8_8_ = 0;
          auVar197._0_8_ = *(ulong *)((long)pvVar15 + lVar39 + lVar42);
          auVar197 = vcvtph2ps_f16c(auVar197);
          auVar7._8_8_ = 0;
          auVar7._0_8_ = *(ulong *)((long)pvVar15 + lVar39 + lVar45);
          auVar77 = vcvtph2ps_f16c(auVar7);
          auVar8._8_8_ = 0;
          auVar8._0_8_ = *(ulong *)((long)pvVar15 + lVar39 + lVar34);
          auVar73 = vcvtph2ps_f16c(auVar8);
          auVar9._8_8_ = 0;
          auVar9._0_8_ = *(ulong *)((long)pvVar15 + lVar39 + lVar37);
          auVar108 = vcvtph2ps_f16c(auVar9);
          auVar109 = *(undefined1 (*) [16])(*local_318 + lVar39 * 2);
          local_278 = vfmadd231ps_fma(local_278,auVar109,auVar197);
          local_288 = vfmadd231ps_fma(local_288,auVar109,auVar77);
          local_298 = vfmadd231ps_fma(local_298,auVar109,auVar73);
          local_2a8 = vfmadd231ps_fma(local_2a8,auVar109,auVar108);
          lVar39 = lVar39 + 8;
          lVar40 = lVar40 + 4;
        }
        for (; (int)lVar40 < iVar33; lVar40 = lVar40 + 1) {
          local_1e8._0_16_ = auVar71;
          local_208._0_16_ = ZEXT416(*(uint *)(*pauVar30 + lVar40 * 4));
          fVar48 = float16_to_float32(*(unsigned_short *)((long)pvVar15 + lVar40 * 2 + lVar42));
          auVar63 = local_228;
          local_228._4_4_ = extraout_XMM0_Db_05;
          local_228._0_4_ = fVar48;
          local_228._8_4_ = extraout_XMM0_Dc_04;
          local_228._16_16_ = auVar63._16_16_;
          local_228._12_4_ = extraout_XMM0_Dd_04;
          uVar3 = *(uint *)(*pauVar30 + lVar40 * 4);
          local_238 = float16_to_float32(*(unsigned_short *)((long)pvVar15 + lVar40 * 2 + lVar45));
          local_248 = ZEXT416(*(uint *)(*pauVar30 + lVar40 * 4));
          local_258 = float16_to_float32(*(unsigned_short *)((long)pvVar15 + lVar40 * 2 + lVar34));
          local_268 = ZEXT416(*(uint *)(*pauVar30 + lVar40 * 4));
          auVar345._0_4_ =
               float16_to_float32(*(unsigned_short *)((long)pvVar15 + lVar40 * 2 + lVar37));
          auVar345._4_60_ = extraout_var_00;
          auVar71 = vinsertps_avx(local_228._0_16_,ZEXT416((uint)local_238),0x10);
          auVar71 = vinsertps_avx(auVar71,ZEXT416((uint)local_258),0x20);
          auVar71 = vinsertps_avx(auVar71,auVar345._0_16_,0x30);
          auVar109 = vinsertps_avx(local_208._0_16_,ZEXT416(uVar3),0x10);
          auVar109 = vinsertps_avx(auVar109,ZEXT416((uint)local_248._0_4_),0x20);
          auVar109 = vinsertps_avx(auVar109,ZEXT416((uint)local_268._0_4_),0x30);
          auVar71 = vfmadd231ps_fma(local_1e8._0_16_,auVar71,auVar109);
          auVar68 = ZEXT3264(local_b8);
          auVar293 = ZEXT3264(local_d8);
          auVar345 = ZEXT3264(local_f8);
          auVar351 = ZEXT3264(local_118);
        }
        auVar63 = vhaddps_avx(auVar68._0_32_,auVar293._0_32_);
        auVar60 = vhaddps_avx(auVar345._0_32_,auVar351._0_32_);
        auVar63 = vhaddps_avx(auVar63,auVar60);
        auVar197 = vunpcklps_avx(local_278,local_288);
        auVar77 = vunpcklps_avx(local_298,local_2a8);
        auVar73 = vunpckhps_avx(local_278,local_288);
        auVar108 = vunpckhps_avx(local_298,local_2a8);
        auVar109 = vmovlhps_avx(auVar197,auVar77);
        auVar77 = vunpckhpd_avx(auVar197,auVar77);
        auVar197 = vmovlhps_avx(auVar73,auVar108);
        auVar73 = vunpckhpd_avx(auVar73,auVar108);
        auVar54._0_4_ =
             auVar77._0_4_ + auVar109._0_4_ + auVar197._0_4_ + auVar73._0_4_ + auVar71._0_4_ +
             auVar63._0_4_ + auVar63._16_4_;
        auVar54._4_4_ =
             auVar77._4_4_ + auVar109._4_4_ + auVar197._4_4_ + auVar73._4_4_ + auVar71._4_4_ +
             auVar63._4_4_ + auVar63._20_4_;
        auVar54._8_4_ =
             auVar77._8_4_ + auVar109._8_4_ + auVar197._8_4_ + auVar73._8_4_ + auVar71._8_4_ +
             auVar63._8_4_ + auVar63._24_4_;
        auVar54._12_4_ =
             auVar77._12_4_ + auVar109._12_4_ + auVar197._12_4_ + auVar73._12_4_ + auVar71._12_4_ +
             auVar63._12_4_ + auVar63._28_4_;
        auVar86 = auVar54;
        if (iVar27 - 1U < 6) {
          auVar71 = ZEXT816(0) << 0x20;
          auVar86 = vmaxps_avx(auVar54,auVar71);
          switch(iVar27) {
          case 2:
            auVar71 = vminps_avx(auVar54,auVar71);
            uVar2 = **(undefined4 **)(&this->field_0xe8 + (long)p_Var12);
            auVar121._4_4_ = uVar2;
            auVar121._0_4_ = uVar2;
            auVar121._8_4_ = uVar2;
            auVar121._12_4_ = uVar2;
            auVar86 = vfmadd231ps_fma(auVar86,auVar71,auVar121);
            break;
          case 3:
            uVar2 = **(undefined4 **)(&this->field_0xe8 + (long)p_Var12);
            auVar80._4_4_ = uVar2;
            auVar80._0_4_ = uVar2;
            auVar80._8_4_ = uVar2;
            auVar80._12_4_ = uVar2;
            uVar2 = (*(undefined4 **)(&this->field_0xe8 + (long)p_Var12))[1];
            auVar126._4_4_ = uVar2;
            auVar126._0_4_ = uVar2;
            auVar126._8_4_ = uVar2;
            auVar126._12_4_ = uVar2;
            auVar71 = vmaxps_avx(auVar54,auVar80);
            auVar86 = vminps_avx(auVar71,auVar126);
            break;
          case 4:
            uVar44 = CONCAT44(auVar54._4_4_,auVar54._0_4_);
            auVar55._0_8_ = uVar44 ^ 0x8000000080000000;
            auVar55._8_4_ = -auVar54._8_4_;
            auVar55._12_4_ = -auVar54._12_4_;
            auVar81._8_4_ = 0x42b0c0a5;
            auVar81._0_8_ = 0x42b0c0a542b0c0a5;
            auVar81._12_4_ = 0x42b0c0a5;
            auVar71 = vminps_avx(auVar55,auVar81);
            auVar82._8_4_ = 0xc2b0c0a5;
            auVar82._0_8_ = 0xc2b0c0a5c2b0c0a5;
            auVar82._12_4_ = 0xc2b0c0a5;
            auVar197 = vmaxps_avx(auVar71,auVar82);
            auVar83._8_4_ = 0x3fb8aa3b;
            auVar83._0_8_ = 0x3fb8aa3b3fb8aa3b;
            auVar83._12_4_ = 0x3fb8aa3b;
            auVar227._8_4_ = 0x3f000000;
            auVar227._0_8_ = 0x3f0000003f000000;
            auVar227._12_4_ = 0x3f000000;
            auVar71 = vfmadd213ps_fma(auVar83,auVar197,auVar227);
            auVar127._0_4_ = (int)auVar71._0_4_;
            auVar127._4_4_ = (int)auVar71._4_4_;
            auVar127._8_4_ = (int)auVar71._8_4_;
            auVar127._12_4_ = (int)auVar71._12_4_;
            auVar109 = vcvtdq2ps_avx(auVar127);
            auVar71 = vcmpps_avx(auVar71,auVar109,1);
            auVar209._8_4_ = 0x3f800000;
            auVar209._0_8_ = 0x3f8000003f800000;
            auVar209._12_4_ = 0x3f800000;
            auVar71 = vandps_avx(auVar71,auVar209);
            auVar71 = vsubps_avx(auVar109,auVar71);
            auVar128._8_4_ = 0x3f318000;
            auVar128._0_8_ = 0x3f3180003f318000;
            auVar128._12_4_ = 0x3f318000;
            auVar109 = vfmsub231ps_fma(auVar197,auVar71,auVar128);
            auVar129._8_4_ = 0x395e8083;
            auVar129._0_8_ = 0x395e8083395e8083;
            auVar129._12_4_ = 0x395e8083;
            auVar197 = vfmsub231ps_fma(auVar109,auVar71,auVar129);
            auVar130._0_4_ = auVar197._0_4_ * auVar197._0_4_;
            auVar130._4_4_ = auVar197._4_4_ * auVar197._4_4_;
            auVar130._8_4_ = auVar197._8_4_ * auVar197._8_4_;
            auVar130._12_4_ = auVar197._12_4_ * auVar197._12_4_;
            auVar181._8_4_ = 0x39506967;
            auVar181._0_8_ = 0x3950696739506967;
            auVar181._12_4_ = 0x39506967;
            auVar257._8_4_ = 0x3ab743ce;
            auVar257._0_8_ = 0x3ab743ce3ab743ce;
            auVar257._12_4_ = 0x3ab743ce;
            auVar109 = vfmadd213ps_fma(auVar181,auVar197,auVar257);
            auVar258._8_4_ = 0x3c088908;
            auVar258._0_8_ = 0x3c0889083c088908;
            auVar258._12_4_ = 0x3c088908;
            auVar109 = vfmadd213ps_fma(auVar109,auVar197,auVar258);
            auVar259._8_4_ = 0x3d2aa9c1;
            auVar259._0_8_ = 0x3d2aa9c13d2aa9c1;
            auVar259._12_4_ = 0x3d2aa9c1;
            auVar109 = vfmadd213ps_fma(auVar109,auVar197,auVar259);
            auVar260._8_4_ = 0x3e2aaaaa;
            auVar260._0_8_ = 0x3e2aaaaa3e2aaaaa;
            auVar260._12_4_ = 0x3e2aaaaa;
            auVar109 = vfmadd213ps_fma(auVar109,auVar197,auVar260);
            auVar109 = vfmadd213ps_fma(auVar109,auVar197,auVar227);
            auVar109 = vfmadd213ps_fma(auVar109,auVar130,auVar197);
            auVar56._0_4_ = auVar109._0_4_ + 1.0;
            auVar56._4_4_ = auVar109._4_4_ + 1.0;
            auVar56._8_4_ = auVar109._8_4_ + 1.0;
            auVar56._12_4_ = auVar109._12_4_ + 1.0;
            auVar84._0_4_ = (int)auVar71._0_4_;
            auVar84._4_4_ = (int)auVar71._4_4_;
            auVar84._8_4_ = (int)auVar71._8_4_;
            auVar84._12_4_ = (int)auVar71._12_4_;
            auVar71 = vpslld_avx(auVar84,0x17);
            auVar71 = vpaddd_avx(auVar71,auVar209);
            auVar109 = vfmadd213ps_fma(auVar71,auVar56,auVar209);
            auVar71 = vrcpps_avx(auVar109);
            auVar109 = vfmsub213ps_fma(auVar109,auVar71,auVar209);
            auVar86 = vfnmadd132ps_fma(auVar109,auVar71,auVar71);
            break;
          case 5:
            auVar309._8_4_ = 0x42b0c0a5;
            auVar309._0_8_ = 0x42b0c0a542b0c0a5;
            auVar309._12_4_ = 0x42b0c0a5;
            auVar71 = vminps_avx(auVar309,auVar54);
            auVar323._8_4_ = 0xc2b0c0a5;
            auVar323._0_8_ = 0xc2b0c0a5c2b0c0a5;
            auVar323._12_4_ = 0xc2b0c0a5;
            auVar197 = vmaxps_avx(auVar323,auVar71);
            auVar331._8_4_ = 0x3fb8aa3b;
            auVar331._0_8_ = 0x3fb8aa3b3fb8aa3b;
            auVar331._12_4_ = 0x3fb8aa3b;
            auVar335._8_4_ = 0x3f000000;
            auVar335._0_8_ = 0x3f0000003f000000;
            auVar335._12_4_ = 0x3f000000;
            auVar71 = vfmadd213ps_fma(auVar331,auVar197,auVar335);
            auVar173._0_4_ = (int)auVar71._0_4_;
            auVar173._4_4_ = (int)auVar71._4_4_;
            auVar173._8_4_ = (int)auVar71._8_4_;
            auVar173._12_4_ = (int)auVar71._12_4_;
            auVar109 = vcvtdq2ps_avx(auVar173);
            auVar71 = vcmpps_avx(auVar71,auVar109,1);
            auVar300._8_4_ = 0x3f800000;
            auVar300._0_8_ = 0x3f8000003f800000;
            auVar300._12_4_ = 0x3f800000;
            auVar71 = vandps_avx(auVar71,auVar300);
            auVar71 = vsubps_avx(auVar109,auVar71);
            auVar340._8_4_ = 0x3f318000;
            auVar340._0_8_ = 0x3f3180003f318000;
            auVar340._12_4_ = 0x3f318000;
            auVar109 = vfmsub231ps_fma(auVar197,auVar71,auVar340);
            auVar310._8_4_ = 0xb95e8083;
            auVar310._0_8_ = 0xb95e8083b95e8083;
            auVar310._12_4_ = 0xb95e8083;
            auVar197 = vfnmsub231ps_fma(auVar109,auVar71,auVar310);
            auVar174._0_4_ = auVar197._0_4_ * auVar197._0_4_;
            auVar174._4_4_ = auVar197._4_4_ * auVar197._4_4_;
            auVar174._8_4_ = auVar197._8_4_ * auVar197._8_4_;
            auVar174._12_4_ = auVar197._12_4_ * auVar197._12_4_;
            auVar353._8_4_ = 0x39506967;
            auVar353._0_8_ = 0x3950696739506967;
            auVar353._12_4_ = 0x39506967;
            auVar347._8_4_ = 0x3ab743ce;
            auVar347._0_8_ = 0x3ab743ce3ab743ce;
            auVar347._12_4_ = 0x3ab743ce;
            auVar109 = vfmadd213ps_fma(auVar353,auVar197,auVar347);
            auVar358._8_4_ = 0x3c088908;
            auVar358._0_8_ = 0x3c0889083c088908;
            auVar358._12_4_ = 0x3c088908;
            auVar109 = vfmadd213ps_fma(auVar109,auVar197,auVar358);
            auVar221._8_4_ = 0x3d2aa9c1;
            auVar221._0_8_ = 0x3d2aa9c13d2aa9c1;
            auVar221._12_4_ = 0x3d2aa9c1;
            auVar109 = vfmadd213ps_fma(auVar109,auVar197,auVar221);
            auVar222._8_4_ = 0x3e2aaaaa;
            auVar222._0_8_ = 0x3e2aaaaa3e2aaaaa;
            auVar222._12_4_ = 0x3e2aaaaa;
            auVar109 = vfmadd213ps_fma(auVar109,auVar197,auVar222);
            auVar109 = vfmadd213ps_fma(auVar109,auVar197,auVar335);
            auVar109 = vfmadd213ps_fma(auVar109,auVar174,auVar197);
            auVar175._0_4_ = auVar109._0_4_ + 1.0;
            auVar175._4_4_ = auVar109._4_4_ + 1.0;
            auVar175._8_4_ = auVar109._8_4_ + 1.0;
            auVar175._12_4_ = auVar109._12_4_ + 1.0;
            auVar78._0_4_ = (int)auVar71._0_4_;
            auVar78._4_4_ = (int)auVar71._4_4_;
            auVar78._8_4_ = (int)auVar71._8_4_;
            auVar78._12_4_ = (int)auVar71._12_4_;
            auVar71 = vpslld_avx(auVar78,0x17);
            auVar71 = vpaddd_avx(auVar71,auVar300);
            auVar73 = vfmadd213ps_fma(auVar71,auVar175,auVar300);
            auVar122._8_4_ = 0x800000;
            auVar122._0_8_ = 0x80000000800000;
            auVar122._12_4_ = 0x800000;
            auVar71 = vmaxps_avx(auVar73,auVar122);
            auVar109 = vpsrld_avx(auVar71,0x17);
            auVar204._8_4_ = 0xffffff82;
            auVar204._0_8_ = 0xffffff82ffffff82;
            auVar204._12_4_ = 0xffffff82;
            auVar109 = vpaddd_avx(auVar109,auVar204);
            auVar205._8_4_ = 0x807fffff;
            auVar205._0_8_ = 0x807fffff807fffff;
            auVar205._12_4_ = 0x807fffff;
            auVar71 = vandps_avx(auVar71,auVar205);
            auVar77 = vorps_avx(auVar335,auVar71);
            auVar197 = vcvtdq2ps_avx(auVar109);
            auVar206._8_4_ = 0x3f3504f3;
            auVar206._0_8_ = 0x3f3504f33f3504f3;
            auVar206._12_4_ = 0x3f3504f3;
            auVar109 = vcmpps_avx(auVar77,auVar206,1);
            auVar71 = vandps_avx(auVar109,auVar77);
            auVar123._0_4_ = auVar77._0_4_ + -1.0 + auVar71._0_4_;
            auVar123._4_4_ = auVar77._4_4_ + -1.0 + auVar71._4_4_;
            auVar123._8_4_ = auVar77._8_4_ + -1.0 + auVar71._8_4_;
            auVar123._12_4_ = auVar77._12_4_ + -1.0 + auVar71._12_4_;
            auVar71 = vandps_avx(auVar109,auVar300);
            auVar109 = vsubps_avx(auVar197,auVar71);
            auVar207._0_4_ = auVar123._0_4_ * auVar123._0_4_;
            auVar207._4_4_ = auVar123._4_4_ * auVar123._4_4_;
            auVar207._8_4_ = auVar123._8_4_ * auVar123._8_4_;
            auVar207._12_4_ = auVar123._12_4_ * auVar123._12_4_;
            auVar223._8_4_ = 0x3d9021bb;
            auVar223._0_8_ = 0x3d9021bb3d9021bb;
            auVar223._12_4_ = 0x3d9021bb;
            auVar249._8_4_ = 0xbdebd1b8;
            auVar249._0_8_ = 0xbdebd1b8bdebd1b8;
            auVar249._12_4_ = 0xbdebd1b8;
            auVar71 = vfmadd213ps_fma(auVar223,auVar123,auVar249);
            auVar250._8_4_ = 0x3def251a;
            auVar250._0_8_ = 0x3def251a3def251a;
            auVar250._12_4_ = 0x3def251a;
            auVar71 = vfmadd213ps_fma(auVar71,auVar123,auVar250);
            auVar251._8_4_ = 0xbdfe5d4f;
            auVar251._0_8_ = 0xbdfe5d4fbdfe5d4f;
            auVar251._12_4_ = 0xbdfe5d4f;
            auVar71 = vfmadd213ps_fma(auVar71,auVar123,auVar251);
            auVar252._8_4_ = 0x3e11e9bf;
            auVar252._0_8_ = 0x3e11e9bf3e11e9bf;
            auVar252._12_4_ = 0x3e11e9bf;
            auVar71 = vfmadd213ps_fma(auVar71,auVar123,auVar252);
            auVar253._8_4_ = 0xbe2aae50;
            auVar253._0_8_ = 0xbe2aae50be2aae50;
            auVar253._12_4_ = 0xbe2aae50;
            auVar71 = vfmadd213ps_fma(auVar71,auVar123,auVar253);
            auVar254._8_4_ = 0x3e4cceac;
            auVar254._0_8_ = 0x3e4cceac3e4cceac;
            auVar254._12_4_ = 0x3e4cceac;
            auVar71 = vfmadd213ps_fma(auVar71,auVar123,auVar254);
            auVar255._8_4_ = 0xbe7ffffc;
            auVar255._0_8_ = 0xbe7ffffcbe7ffffc;
            auVar255._12_4_ = 0xbe7ffffc;
            auVar71 = vfmadd213ps_fma(auVar71,auVar123,auVar255);
            auVar256._8_4_ = 0x3eaaaaaa;
            auVar256._0_8_ = 0x3eaaaaaa3eaaaaaa;
            auVar256._12_4_ = 0x3eaaaaaa;
            auVar71 = vfmadd213ps_fma(auVar71,auVar123,auVar256);
            auVar224._0_4_ = auVar207._0_4_ * auVar123._0_4_ * auVar71._0_4_;
            auVar224._4_4_ = auVar207._4_4_ * auVar123._4_4_ * auVar71._4_4_;
            auVar224._8_4_ = auVar207._8_4_ * auVar123._8_4_ * auVar71._8_4_;
            auVar224._12_4_ = auVar207._12_4_ * auVar123._12_4_ * auVar71._12_4_;
            auVar23._12_4_ = 0;
            auVar23._0_12_ = ZEXT412(0);
            auVar71 = vfmadd231ps_fma(auVar224,auVar109,auVar310);
            auVar197 = vfmsub231ps_fma(auVar71,auVar335,auVar207);
            auVar71 = vcmpps_avx(auVar73,auVar23 << 0x20,2);
            auVar197 = vsubps_avx(auVar197,auVar123);
            auVar109 = vfnmadd231ps_fma(auVar197,auVar340,auVar109);
            auVar124._0_4_ = auVar109._0_4_ + auVar109._0_4_;
            auVar124._4_4_ = auVar109._4_4_ + auVar109._4_4_;
            auVar124._8_4_ = auVar109._8_4_ + auVar109._8_4_;
            auVar124._12_4_ = auVar109._12_4_ + auVar109._12_4_;
            auVar176._8_4_ = 0x7fffffff;
            auVar176._0_8_ = 0x7fffffff7fffffff;
            auVar176._12_4_ = 0x7fffffff;
            auVar71 = vblendvps_avx(auVar124,auVar176,auVar71);
            auVar125._8_4_ = 0x42b0c0a5;
            auVar125._0_8_ = 0x42b0c0a542b0c0a5;
            auVar125._12_4_ = 0x42b0c0a5;
            auVar71 = vminps_avx(auVar71,auVar125);
            auVar197 = vmaxps_avx(auVar323,auVar71);
            auVar71 = vfmadd213ps_fma(auVar331,auVar197,auVar335);
            auVar177._0_4_ = (int)auVar71._0_4_;
            auVar177._4_4_ = (int)auVar71._4_4_;
            auVar177._8_4_ = (int)auVar71._8_4_;
            auVar177._12_4_ = (int)auVar71._12_4_;
            auVar109 = vcvtdq2ps_avx(auVar177);
            auVar71 = vcmpps_avx(auVar71,auVar109,1);
            auVar71 = vandps_avx(auVar71,auVar300);
            auVar71 = vsubps_avx(auVar109,auVar71);
            auVar109 = vfmsub231ps_fma(auVar197,auVar71,auVar340);
            auVar197 = vfnmsub231ps_fma(auVar109,auVar71,auVar310);
            auVar178._0_4_ = auVar197._0_4_ * auVar197._0_4_;
            auVar178._4_4_ = auVar197._4_4_ * auVar197._4_4_;
            auVar178._8_4_ = auVar197._8_4_ * auVar197._8_4_;
            auVar178._12_4_ = auVar197._12_4_ * auVar197._12_4_;
            auVar109 = vfmadd213ps_fma(auVar353,auVar197,auVar347);
            auVar109 = vfmadd213ps_fma(auVar109,auVar197,auVar358);
            auVar225._8_4_ = 0x3d2aa9c1;
            auVar225._0_8_ = 0x3d2aa9c13d2aa9c1;
            auVar225._12_4_ = 0x3d2aa9c1;
            auVar109 = vfmadd213ps_fma(auVar109,auVar197,auVar225);
            auVar226._8_4_ = 0x3e2aaaaa;
            auVar226._0_8_ = 0x3e2aaaaa3e2aaaaa;
            auVar226._12_4_ = 0x3e2aaaaa;
            auVar109 = vfmadd213ps_fma(auVar109,auVar197,auVar226);
            auVar109 = vfmadd213ps_fma(auVar109,auVar197,auVar335);
            auVar109 = vfmadd213ps_fma(auVar109,auVar178,auVar197);
            auVar179._0_4_ = auVar109._0_4_ + 1.0;
            auVar179._4_4_ = auVar109._4_4_ + 1.0;
            auVar179._8_4_ = auVar109._8_4_ + 1.0;
            auVar179._12_4_ = auVar109._12_4_ + 1.0;
            auVar79._0_4_ = (int)auVar71._0_4_;
            auVar79._4_4_ = (int)auVar71._4_4_;
            auVar79._8_4_ = (int)auVar71._8_4_;
            auVar79._12_4_ = (int)auVar71._12_4_;
            auVar71 = vpslld_avx(auVar79,0x17);
            auVar71 = vpaddd_avx(auVar71,auVar300);
            auVar109 = vfmadd213ps_fma(auVar71,auVar179,auVar300);
            auVar71 = vrcpps_avx(auVar109);
            auVar180._0_4_ = auVar71._0_4_ + auVar71._0_4_;
            auVar180._4_4_ = auVar71._4_4_ + auVar71._4_4_;
            auVar180._8_4_ = auVar71._8_4_ + auVar71._8_4_;
            auVar180._12_4_ = auVar71._12_4_ + auVar71._12_4_;
            auVar208._8_4_ = 0x40000000;
            auVar208._0_8_ = 0x4000000040000000;
            auVar208._12_4_ = 0x40000000;
            auVar109 = vfmsub213ps_fma(auVar109,auVar180,auVar208);
            auVar71 = vfnmadd213ps_fma(auVar109,auVar71,auVar180);
            auVar86 = vfmsub213ps_fma(auVar71,auVar54,auVar54);
            break;
          case 6:
            uVar2 = **(undefined4 **)(&this->field_0xe8 + (long)p_Var12);
            auVar85._4_4_ = uVar2;
            auVar85._0_4_ = uVar2;
            auVar85._8_4_ = uVar2;
            auVar85._12_4_ = uVar2;
            uVar2 = (*(undefined4 **)(&this->field_0xe8 + (long)p_Var12))[1];
            auVar131._4_4_ = uVar2;
            auVar131._0_4_ = uVar2;
            auVar131._8_4_ = uVar2;
            auVar131._12_4_ = uVar2;
            auVar109 = vfmadd231ps_fma(auVar131,auVar54,auVar85);
            auVar71 = vmaxps_avx(auVar109,auVar71);
            auVar132._8_4_ = 0x3f800000;
            auVar132._0_8_ = 0x3f8000003f800000;
            auVar132._12_4_ = 0x3f800000;
            auVar71 = vminps_avx(auVar71,auVar132);
            auVar86._0_4_ = auVar71._0_4_ * auVar54._0_4_;
            auVar86._4_4_ = auVar71._4_4_ * auVar54._4_4_;
            auVar86._8_4_ = auVar71._8_4_ * auVar54._8_4_;
            auVar86._12_4_ = auVar71._12_4_ * auVar54._12_4_;
          }
        }
        *(undefined1 (*) [16])((long)top_blob->data + local_198._0_8_ * 4) = auVar86;
        local_138._0_8_ = local_138._0_8_ + 4;
        lVar34 = local_158._0_8_ + 4;
        local_2b8 = local_2b8 + 4;
        local_2c8._0_8_ = local_2c8._0_8_ + 4;
        uVar44 = local_178._0_8_ + 1;
      }
      for (lVar34 = (long)(int)(local_1b8._0_4_ + uVar25 * 4); pauVar30 = local_318,
          lVar34 < (int)uVar11; lVar34 = lVar34 + 1) {
        if (lVar14 == 0) {
          auVar68 = ZEXT1664(ZEXT816(0) << 0x40);
        }
        else {
          auVar68 = ZEXT464(*(uint *)(lVar14 + lVar34 * 4));
        }
        pvVar15 = (this->weight_data_tm).data;
        sVar16 = (this->weight_data_tm).elemsize;
        lVar39 = (long)(this->weight_data_tm).w;
        pauVar35 = (undefined1 (*) [16])(lVar34 * lVar39 * sVar16 + (long)pvVar15);
        lVar37 = 0;
        auVar71 = ZEXT816(0) << 0x40;
        iVar36 = 0;
        pauVar29 = local_318;
        while( true ) {
          auVar293 = ZEXT1664(auVar71);
          local_208 = ZEXT1632(auVar71);
          if (iVar33 <= iVar36 + 7) break;
          auVar71 = vlddqu_avx(*pauVar35);
          auVar63 = vcvtph2ps_f16c(auVar71);
          auVar71 = vfmadd231ps_fma(local_208,auVar63,*pauVar29);
          pauVar29 = pauVar29 + 1;
          pauVar35 = pauVar35 + 1;
          iVar36 = iVar36 + 8;
          lVar37 = lVar37 + 8;
        }
        auVar71 = ZEXT816(0) << 0x40;
        for (; iVar36 + 3 < iVar33; iVar36 = iVar36 + 4) {
          auVar10._8_8_ = 0;
          auVar10._0_8_ = *(ulong *)*pauVar35;
          auVar109 = vcvtph2ps_f16c(auVar10);
          auVar71 = vfmadd231ps_fma(auVar71,auVar109,*(undefined1 (*) [16])*pauVar29);
          pauVar29 = (undefined1 (*) [32])(*pauVar29 + 0x10);
          pauVar35 = (undefined1 (*) [16])(*pauVar35 + 8);
          lVar37 = lVar37 + 4;
        }
        local_228._0_16_ = auVar71;
        for (; (int)lVar37 < iVar33; lVar37 = lVar37 + 1) {
          local_1e8._0_4_ = *(undefined4 *)(*pauVar30 + lVar37 * 4);
          auVar351._0_4_ =
               float16_to_float32(*(unsigned_short *)
                                   ((long)pvVar15 + lVar37 * 2 + sVar16 * lVar34 * lVar39));
          auVar351._4_60_ = extraout_var_01;
          auVar71 = vfmadd231ss_fma(ZEXT416((uint)auVar68._0_4_),auVar351._0_16_,
                                    ZEXT416((uint)local_1e8._0_4_));
          auVar68 = ZEXT1664(auVar71);
          auVar293 = ZEXT3264(local_208);
          auVar71 = local_228._0_16_;
        }
        auVar57._0_4_ = auVar293._0_4_ + auVar71._0_4_ + auVar293._16_4_;
        auVar57._4_4_ = auVar293._4_4_ + auVar71._4_4_ + auVar293._20_4_;
        auVar57._8_4_ = auVar293._8_4_ + auVar71._8_4_ + auVar293._24_4_;
        auVar57._12_4_ = auVar293._12_4_ + auVar71._12_4_ + auVar293._28_4_;
        auVar71 = vhaddps_avx(auVar57,auVar57);
        auVar71 = vhaddps_avx(auVar71,auVar71);
        fVar48 = auVar71._0_4_ + auVar68._0_4_;
        auVar71 = ZEXT416((uint)fVar48);
        fVar69 = fVar48;
        switch(iVar27) {
        case 1:
          auVar71 = vmaxss_avx(auVar71,ZEXT416(0));
          fVar69 = auVar71._0_4_;
          break;
        case 2:
          auVar71 = vcmpss_avx(ZEXT816(0) << 0x20,auVar71,1);
          auVar134._8_4_ = 0x3f800000;
          auVar134._0_8_ = 0x3f8000003f800000;
          auVar134._12_4_ = 0x3f800000;
          auVar71 = vblendvps_avx(ZEXT416(**(uint **)(&this->field_0xe8 + (long)p_Var12)),auVar134,
                                  auVar71);
          fVar69 = auVar71._0_4_ * fVar48;
          break;
        case 3:
          fVar48 = (float)(*(uint **)(&this->field_0xe8 + (long)p_Var12))[1];
          auVar71 = vmaxss_avx(auVar71,ZEXT416(**(uint **)(&this->field_0xe8 + (long)p_Var12)));
          fVar69 = auVar71._0_4_;
          if (fVar48 < auVar71._0_4_) {
            fVar69 = fVar48;
          }
          break;
        case 4:
          auVar71 = vminss_avx(auVar71,ZEXT416(0x42b0c0a5));
          auVar87._0_8_ = auVar71._0_8_ ^ 0x8000000080000000;
          auVar87._8_4_ = auVar71._8_4_ ^ 0x80000000;
          auVar87._12_4_ = auVar71._12_4_ ^ 0x80000000;
          auVar71 = vcmpss_avx(auVar71,ZEXT416(0xc2b0c0a5),1);
          auVar133._8_4_ = 0x42b0c0a5;
          auVar133._0_8_ = 0x42b0c0a542b0c0a5;
          auVar133._12_4_ = 0x42b0c0a5;
          auVar71 = vblendvps_avx(auVar87,auVar133,auVar71);
          fVar48 = expf(auVar71._0_4_);
          fVar69 = 1.0 / (fVar48 + 1.0);
          break;
        case 5:
          fVar69 = expf(fVar48);
          fVar69 = logf(fVar69 + 1.0);
          fVar69 = tanhf(fVar69);
          fVar69 = fVar69 * fVar48;
          break;
        case 6:
          fVar4 = **(float **)(&this->field_0xe8 + (long)p_Var12);
          fVar5 = (*(float **)(&this->field_0xe8 + (long)p_Var12))[1];
          fVar161 = -fVar5 / fVar4;
          fVar69 = 0.0;
          if ((fVar161 <= fVar48) && (fVar69 = fVar48, fVar48 <= fVar161 + 1.0 / fVar4)) {
            auVar71 = vfmadd213ss_fma(ZEXT416((uint)fVar4),auVar71,ZEXT416((uint)fVar5));
            fVar69 = auVar71._0_4_ * fVar48;
          }
        }
        *(float *)((long)top_blob->data + lVar34 * 4) = fVar69;
      }
    }
    else if (iVar36 == 4) {
      uVar44 = (ulong)uVar11;
      if ((int)uVar11 < 1) {
        uVar44 = 0;
      }
      auVar68 = ZEXT1664(ZEXT816(0) << 0x40);
      auVar293 = ZEXT1664(CONCAT412(0x3f800000,CONCAT48(0x3f800000,0x3f8000003f800000)));
      for (uVar28 = 0; uVar28 != uVar44; uVar28 = uVar28 + 1) {
        if (lVar14 == 0) {
          auVar71 = ZEXT816(0) << 0x40;
        }
        else {
          auVar71 = *(undefined1 (*) [16])(lVar14 + uVar28 * 0x10);
        }
        pvVar15 = (this->weight_data_tm).data;
        sVar16 = (this->weight_data_tm).elemsize;
        lVar39 = (long)(this->weight_data_tm).w;
        pauVar29 = (undefined1 (*) [32])(uVar28 * lVar39 * sVar16 + (long)pvVar15);
        lVar34 = 0;
        auVar73 = ZEXT816(0) << 0x40;
        auVar77 = ZEXT816(0) << 0x40;
        auVar197 = ZEXT816(0) << 0x40;
        auVar109 = ZEXT816(0) << 0x40;
        pauVar30 = local_318;
        for (iVar36 = 0; iVar36 + 7 < iVar33; iVar36 = iVar36 + 8) {
          uVar2 = *(undefined4 *)*pauVar30;
          auVar212._4_4_ = uVar2;
          auVar212._0_4_ = uVar2;
          auVar212._8_4_ = uVar2;
          auVar212._12_4_ = uVar2;
          uVar2 = *(undefined4 *)(*pauVar30 + 4);
          auVar212._20_4_ = uVar2;
          auVar212._16_4_ = uVar2;
          auVar212._24_4_ = uVar2;
          auVar212._28_4_ = uVar2;
          uVar2 = *(undefined4 *)(*pauVar30 + 8);
          auVar326._4_4_ = uVar2;
          auVar326._0_4_ = uVar2;
          auVar326._8_4_ = uVar2;
          auVar326._12_4_ = uVar2;
          uVar2 = *(undefined4 *)(*pauVar30 + 0xc);
          auVar326._20_4_ = uVar2;
          auVar326._16_4_ = uVar2;
          auVar326._24_4_ = uVar2;
          auVar326._28_4_ = uVar2;
          uVar2 = *(undefined4 *)(*pauVar30 + 0x10);
          auVar337._4_4_ = uVar2;
          auVar337._0_4_ = uVar2;
          auVar337._8_4_ = uVar2;
          auVar337._12_4_ = uVar2;
          uVar2 = *(undefined4 *)(*pauVar30 + 0x14);
          auVar337._20_4_ = uVar2;
          auVar337._16_4_ = uVar2;
          auVar337._24_4_ = uVar2;
          auVar337._28_4_ = uVar2;
          uVar2 = *(undefined4 *)(*pauVar30 + 0x18);
          auVar343._4_4_ = uVar2;
          auVar343._0_4_ = uVar2;
          auVar343._8_4_ = uVar2;
          auVar343._12_4_ = uVar2;
          uVar2 = *(undefined4 *)(*pauVar30 + 0x1c);
          auVar343._20_4_ = uVar2;
          auVar343._16_4_ = uVar2;
          auVar343._24_4_ = uVar2;
          auVar343._28_4_ = uVar2;
          auVar63 = vlddqu_avx(*pauVar29);
          auVar60 = vlddqu_avx(pauVar29[1]);
          auVar107 = vcvtph2ps_f16c(auVar63._0_16_);
          auVar63 = vcvtph2ps_f16c(auVar63._16_16_);
          auVar64 = vcvtph2ps_f16c(auVar60._0_16_);
          auVar60 = vcvtph2ps_f16c(auVar60._16_16_);
          auVar109 = vfmadd231ps_fma(ZEXT1632(auVar109),auVar212,auVar107);
          auVar197 = vfmadd231ps_fma(ZEXT1632(auVar197),auVar326,auVar63);
          auVar77 = vfmadd231ps_fma(ZEXT1632(auVar77),auVar337,auVar64);
          auVar73 = vfmadd231ps_fma(ZEXT1632(auVar73),auVar343,auVar60);
          pauVar30 = pauVar30 + 1;
          pauVar29 = pauVar29 + 2;
          lVar34 = lVar34 + 8;
        }
        for (; iVar36 + 3 < iVar33; iVar36 = iVar36 + 4) {
          uVar2 = *(undefined4 *)*pauVar30;
          auVar213._4_4_ = uVar2;
          auVar213._0_4_ = uVar2;
          auVar213._8_4_ = uVar2;
          auVar213._12_4_ = uVar2;
          uVar2 = *(undefined4 *)(*pauVar30 + 4);
          auVar213._20_4_ = uVar2;
          auVar213._16_4_ = uVar2;
          auVar213._24_4_ = uVar2;
          auVar213._28_4_ = uVar2;
          uVar2 = *(undefined4 *)(*pauVar30 + 8);
          auVar304._4_4_ = uVar2;
          auVar304._0_4_ = uVar2;
          auVar304._8_4_ = uVar2;
          auVar304._12_4_ = uVar2;
          uVar2 = *(undefined4 *)(*pauVar30 + 0xc);
          auVar304._20_4_ = uVar2;
          auVar304._16_4_ = uVar2;
          auVar304._24_4_ = uVar2;
          auVar304._28_4_ = uVar2;
          auVar63 = vlddqu_avx(*pauVar29);
          auVar60 = vcvtph2ps_f16c(auVar63._0_16_);
          auVar63 = vcvtph2ps_f16c(auVar63._16_16_);
          auVar109 = vfmadd231ps_fma(ZEXT1632(auVar109),auVar213,auVar60);
          auVar197 = vfmadd231ps_fma(ZEXT1632(auVar197),auVar304,auVar63);
          pauVar30 = (undefined1 (*) [32])(*pauVar30 + 0x10);
          pauVar29 = pauVar29 + 1;
          lVar34 = lVar34 + 4;
        }
        for (; (int)lVar34 < iVar33; lVar34 = lVar34 + 1) {
          uVar2 = *(undefined4 *)(*local_318 + lVar34 * 4);
          auVar193._4_4_ = uVar2;
          auVar193._0_4_ = uVar2;
          auVar193._8_4_ = uVar2;
          auVar193._12_4_ = uVar2;
          auVar6._8_8_ = 0;
          auVar6._0_8_ = *(ulong *)((long)pvVar15 + lVar34 * 8 + sVar16 * uVar28 * lVar39);
          auVar108 = vcvtph2ps_f16c(auVar6);
          auVar71 = vfmadd231ps_fma(auVar71,auVar193,auVar108);
        }
        auVar74._0_4_ =
             auVar71._0_4_ + auVar77._0_4_ + auVar73._0_4_ + auVar197._0_4_ + auVar109._0_4_ + 0.0;
        auVar74._4_4_ =
             auVar71._4_4_ + auVar77._4_4_ + auVar73._4_4_ + auVar197._4_4_ + auVar109._4_4_ + 0.0;
        auVar74._8_4_ =
             auVar71._8_4_ + auVar77._8_4_ + auVar73._8_4_ + auVar197._8_4_ + auVar109._8_4_ + 0.0;
        auVar74._12_4_ =
             auVar71._12_4_ + auVar77._12_4_ + auVar73._12_4_ + auVar197._12_4_ + auVar109._12_4_ +
             0.0;
        auVar119 = auVar74;
        if (iVar27 - 1U < 6) {
          auVar71 = auVar68._0_16_;
          auVar119 = vmaxps_avx(auVar74,auVar71);
          auVar109 = auVar293._0_16_;
          fVar48 = auVar293._0_4_;
          fVar69 = auVar293._4_4_;
          fVar4 = auVar293._8_4_;
          fVar5 = auVar293._12_4_;
          switch(iVar27) {
          case 2:
            auVar71 = vminps_avx(auVar74,auVar71);
            uVar2 = **(undefined4 **)(&this->field_0xe8 + (long)p_Var12);
            auVar162._4_4_ = uVar2;
            auVar162._0_4_ = uVar2;
            auVar162._8_4_ = uVar2;
            auVar162._12_4_ = uVar2;
            auVar119 = vfmadd231ps_fma(auVar119,auVar71,auVar162);
            break;
          case 3:
            uVar2 = **(undefined4 **)(&this->field_0xe8 + (long)p_Var12);
            auVar113._4_4_ = uVar2;
            auVar113._0_4_ = uVar2;
            auVar113._8_4_ = uVar2;
            auVar113._12_4_ = uVar2;
            uVar2 = (*(undefined4 **)(&this->field_0xe8 + (long)p_Var12))[1];
            auVar167._4_4_ = uVar2;
            auVar167._0_4_ = uVar2;
            auVar167._8_4_ = uVar2;
            auVar167._12_4_ = uVar2;
            auVar71 = vmaxps_avx(auVar74,auVar113);
            auVar119 = vminps_avx(auVar71,auVar167);
            break;
          case 4:
            uVar24 = CONCAT44(auVar74._4_4_,auVar74._0_4_);
            auVar75._0_8_ = uVar24 ^ 0x8000000080000000;
            auVar75._8_4_ = -auVar74._8_4_;
            auVar75._12_4_ = -auVar74._12_4_;
            auVar114._8_4_ = 0x42b0c0a5;
            auVar114._0_8_ = 0x42b0c0a542b0c0a5;
            auVar114._12_4_ = 0x42b0c0a5;
            auVar71 = vminps_avx(auVar75,auVar114);
            auVar115._8_4_ = 0xc2b0c0a5;
            auVar115._0_8_ = 0xc2b0c0a5c2b0c0a5;
            auVar115._12_4_ = 0xc2b0c0a5;
            auVar77 = vmaxps_avx(auVar71,auVar115);
            auVar116._8_4_ = 0x3fb8aa3b;
            auVar116._0_8_ = 0x3fb8aa3b3fb8aa3b;
            auVar116._12_4_ = 0x3fb8aa3b;
            auVar52._8_4_ = 0x3f000000;
            auVar52._0_8_ = 0x3f0000003f000000;
            auVar52._12_4_ = 0x3f000000;
            auVar71 = vfmadd213ps_fma(auVar116,auVar77,auVar52);
            auVar168._0_4_ = (int)auVar71._0_4_;
            auVar168._4_4_ = (int)auVar71._4_4_;
            auVar168._8_4_ = (int)auVar71._8_4_;
            auVar168._12_4_ = (int)auVar71._12_4_;
            auVar197 = vcvtdq2ps_avx(auVar168);
            auVar71 = vcmpps_avx(auVar71,auVar197,1);
            auVar71 = vandps_avx(auVar71,auVar109);
            auVar71 = vsubps_avx(auVar197,auVar71);
            auVar169._8_4_ = 0x3f318000;
            auVar169._0_8_ = 0x3f3180003f318000;
            auVar169._12_4_ = 0x3f318000;
            auVar197 = vfmsub231ps_fma(auVar77,auVar71,auVar169);
            auVar170._8_4_ = 0x395e8083;
            auVar170._0_8_ = 0x395e8083395e8083;
            auVar170._12_4_ = 0x395e8083;
            auVar77 = vfmsub231ps_fma(auVar197,auVar71,auVar170);
            auVar171._0_4_ = auVar77._0_4_ * auVar77._0_4_;
            auVar171._4_4_ = auVar77._4_4_ * auVar77._4_4_;
            auVar171._8_4_ = auVar77._8_4_ * auVar77._8_4_;
            auVar171._12_4_ = auVar77._12_4_ * auVar77._12_4_;
            auVar203._8_4_ = 0x39506967;
            auVar203._0_8_ = 0x3950696739506967;
            auVar203._12_4_ = 0x39506967;
            auVar299._8_4_ = 0x3ab743ce;
            auVar299._0_8_ = 0x3ab743ce3ab743ce;
            auVar299._12_4_ = 0x3ab743ce;
            auVar197 = vfmadd213ps_fma(auVar203,auVar77,auVar299);
            auVar218._8_4_ = 0x3c088908;
            auVar218._0_8_ = 0x3c0889083c088908;
            auVar218._12_4_ = 0x3c088908;
            auVar197 = vfmadd213ps_fma(auVar197,auVar77,auVar218);
            auVar219._8_4_ = 0x3d2aa9c1;
            auVar219._0_8_ = 0x3d2aa9c13d2aa9c1;
            auVar219._12_4_ = 0x3d2aa9c1;
            auVar197 = vfmadd213ps_fma(auVar197,auVar77,auVar219);
            auVar220._8_4_ = 0x3e2aaaaa;
            auVar220._0_8_ = 0x3e2aaaaa3e2aaaaa;
            auVar220._12_4_ = 0x3e2aaaaa;
            auVar197 = vfmadd213ps_fma(auVar197,auVar77,auVar220);
            auVar197 = vfmadd213ps_fma(auVar197,auVar77,auVar52);
            auVar68 = ZEXT864(0) << 0x20;
            auVar197 = vfmadd213ps_fma(auVar197,auVar171,auVar77);
            auVar76._0_4_ = auVar197._0_4_ + fVar48;
            auVar76._4_4_ = auVar197._4_4_ + fVar69;
            auVar76._8_4_ = auVar197._8_4_ + fVar4;
            auVar76._12_4_ = auVar197._12_4_ + fVar5;
            auVar117._0_4_ = (int)auVar71._0_4_;
            auVar117._4_4_ = (int)auVar71._4_4_;
            auVar117._8_4_ = (int)auVar71._8_4_;
            auVar117._12_4_ = (int)auVar71._12_4_;
            auVar71 = vpslld_avx(auVar117,0x17);
            auVar71 = vpaddd_avx(auVar71,auVar109);
            auVar197 = vfmadd213ps_fma(auVar71,auVar76,auVar109);
            auVar71 = vrcpps_avx(auVar197);
            auVar109 = vfmsub213ps_fma(auVar197,auVar71,auVar109);
            auVar119 = vfnmadd132ps_fma(auVar109,auVar71,auVar71);
            break;
          case 5:
            auVar329._8_4_ = 0x42b0c0a5;
            auVar329._0_8_ = 0x42b0c0a542b0c0a5;
            auVar329._12_4_ = 0x42b0c0a5;
            auVar71 = vminps_avx(auVar329,auVar74);
            auVar334._8_4_ = 0xc2b0c0a5;
            auVar334._0_8_ = 0xc2b0c0a5c2b0c0a5;
            auVar334._12_4_ = 0xc2b0c0a5;
            auVar77 = vmaxps_avx(auVar334,auVar71);
            auVar339._8_4_ = 0x3fb8aa3b;
            auVar339._0_8_ = 0x3fb8aa3b3fb8aa3b;
            auVar339._12_4_ = 0x3fb8aa3b;
            auVar330._8_4_ = 0x3f000000;
            auVar330._0_8_ = 0x3f0000003f000000;
            auVar330._12_4_ = 0x3f000000;
            auVar71 = vfmadd213ps_fma(auVar339,auVar77,auVar330);
            auVar194._0_4_ = (int)auVar71._0_4_;
            auVar194._4_4_ = (int)auVar71._4_4_;
            auVar194._8_4_ = (int)auVar71._8_4_;
            auVar194._12_4_ = (int)auVar71._12_4_;
            auVar197 = vcvtdq2ps_avx(auVar194);
            auVar71 = vcmpps_avx(auVar71,auVar197,1);
            auVar71 = vandps_avx(auVar71,auVar109);
            auVar71 = vsubps_avx(auVar197,auVar71);
            auVar346._8_4_ = 0x3f318000;
            auVar346._0_8_ = 0x3f3180003f318000;
            auVar346._12_4_ = 0x3f318000;
            auVar197 = vfmsub231ps_fma(auVar77,auVar71,auVar346);
            auVar248._8_4_ = 0xb95e8083;
            auVar248._0_8_ = 0xb95e8083b95e8083;
            auVar248._12_4_ = 0xb95e8083;
            auVar77 = vfnmsub231ps_fma(auVar197,auVar71,auVar248);
            auVar195._0_4_ = auVar77._0_4_ * auVar77._0_4_;
            auVar195._4_4_ = auVar77._4_4_ * auVar77._4_4_;
            auVar195._8_4_ = auVar77._8_4_ * auVar77._8_4_;
            auVar195._12_4_ = auVar77._12_4_ * auVar77._12_4_;
            auVar357._8_4_ = 0x39506967;
            auVar357._0_8_ = 0x3950696739506967;
            auVar357._12_4_ = 0x39506967;
            auVar352._8_4_ = 0x3ab743ce;
            auVar352._0_8_ = 0x3ab743ce3ab743ce;
            auVar352._12_4_ = 0x3ab743ce;
            auVar197 = vfmadd213ps_fma(auVar357,auVar77,auVar352);
            auVar216._8_4_ = 0x3c088908;
            auVar216._0_8_ = 0x3c0889083c088908;
            auVar216._12_4_ = 0x3c088908;
            auVar197 = vfmadd213ps_fma(auVar197,auVar77,auVar216);
            auVar305._8_4_ = 0x3d2aa9c1;
            auVar305._0_8_ = 0x3d2aa9c13d2aa9c1;
            auVar305._12_4_ = 0x3d2aa9c1;
            auVar197 = vfmadd213ps_fma(auVar197,auVar77,auVar305);
            auVar306._8_4_ = 0x3e2aaaaa;
            auVar306._0_8_ = 0x3e2aaaaa3e2aaaaa;
            auVar306._12_4_ = 0x3e2aaaaa;
            auVar197 = vfmadd213ps_fma(auVar197,auVar77,auVar306);
            auVar197 = vfmadd213ps_fma(auVar197,auVar77,auVar330);
            auVar197 = vfmadd213ps_fma(auVar197,auVar195,auVar77);
            auVar196._0_4_ = auVar197._0_4_ + fVar48;
            auVar196._4_4_ = auVar197._4_4_ + fVar69;
            auVar196._8_4_ = auVar197._8_4_ + fVar4;
            auVar196._12_4_ = auVar197._12_4_ + fVar5;
            auVar111._0_4_ = (int)auVar71._0_4_;
            auVar111._4_4_ = (int)auVar71._4_4_;
            auVar111._8_4_ = (int)auVar71._8_4_;
            auVar111._12_4_ = (int)auVar71._12_4_;
            auVar71 = vpslld_avx(auVar111,0x17);
            auVar71 = vpaddd_avx(auVar71,auVar109);
            auVar108 = vfmadd213ps_fma(auVar71,auVar196,auVar109);
            auVar163._8_4_ = 0x800000;
            auVar163._0_8_ = 0x80000000800000;
            auVar163._12_4_ = 0x800000;
            auVar71 = vmaxps_avx(auVar108,auVar163);
            auVar197 = vpsrld_avx(auVar71,0x17);
            auVar295._8_4_ = 0xffffff82;
            auVar295._0_8_ = 0xffffff82ffffff82;
            auVar295._12_4_ = 0xffffff82;
            auVar197 = vpaddd_avx(auVar197,auVar295);
            auVar296._8_4_ = 0x807fffff;
            auVar296._0_8_ = 0x807fffff807fffff;
            auVar296._12_4_ = 0x807fffff;
            auVar71 = vandps_avx(auVar71,auVar296);
            auVar73 = vorps_avx(auVar330,auVar71);
            auVar77 = vcvtdq2ps_avx(auVar197);
            auVar297._8_4_ = 0x3f3504f3;
            auVar297._0_8_ = 0x3f3504f33f3504f3;
            auVar297._12_4_ = 0x3f3504f3;
            auVar197 = vcmpps_avx(auVar73,auVar297,1);
            auVar71 = vandps_avx(auVar197,auVar73);
            auVar164._0_4_ = auVar71._0_4_ + auVar73._0_4_ + -1.0;
            auVar164._4_4_ = auVar71._4_4_ + auVar73._4_4_ + -1.0;
            auVar164._8_4_ = auVar71._8_4_ + auVar73._8_4_ + -1.0;
            auVar164._12_4_ = auVar71._12_4_ + auVar73._12_4_ + -1.0;
            auVar71 = vandps_avx(auVar197,auVar109);
            auVar197 = vsubps_avx(auVar77,auVar71);
            auVar298._0_4_ = auVar164._0_4_ * auVar164._0_4_;
            auVar298._4_4_ = auVar164._4_4_ * auVar164._4_4_;
            auVar298._8_4_ = auVar164._8_4_ * auVar164._8_4_;
            auVar298._12_4_ = auVar164._12_4_ * auVar164._12_4_;
            auVar307._8_4_ = 0x3d9021bb;
            auVar307._0_8_ = 0x3d9021bb3d9021bb;
            auVar307._12_4_ = 0x3d9021bb;
            auVar315._8_4_ = 0xbdebd1b8;
            auVar315._0_8_ = 0xbdebd1b8bdebd1b8;
            auVar315._12_4_ = 0xbdebd1b8;
            auVar71 = vfmadd213ps_fma(auVar307,auVar164,auVar315);
            auVar316._8_4_ = 0x3def251a;
            auVar316._0_8_ = 0x3def251a3def251a;
            auVar316._12_4_ = 0x3def251a;
            auVar71 = vfmadd213ps_fma(auVar71,auVar164,auVar316);
            auVar317._8_4_ = 0xbdfe5d4f;
            auVar317._0_8_ = 0xbdfe5d4fbdfe5d4f;
            auVar317._12_4_ = 0xbdfe5d4f;
            auVar71 = vfmadd213ps_fma(auVar71,auVar164,auVar317);
            auVar318._8_4_ = 0x3e11e9bf;
            auVar318._0_8_ = 0x3e11e9bf3e11e9bf;
            auVar318._12_4_ = 0x3e11e9bf;
            auVar71 = vfmadd213ps_fma(auVar71,auVar164,auVar318);
            auVar319._8_4_ = 0xbe2aae50;
            auVar319._0_8_ = 0xbe2aae50be2aae50;
            auVar319._12_4_ = 0xbe2aae50;
            auVar71 = vfmadd213ps_fma(auVar71,auVar164,auVar319);
            auVar320._8_4_ = 0x3e4cceac;
            auVar320._0_8_ = 0x3e4cceac3e4cceac;
            auVar320._12_4_ = 0x3e4cceac;
            auVar71 = vfmadd213ps_fma(auVar71,auVar164,auVar320);
            auVar321._8_4_ = 0xbe7ffffc;
            auVar321._0_8_ = 0xbe7ffffcbe7ffffc;
            auVar321._12_4_ = 0xbe7ffffc;
            auVar71 = vfmadd213ps_fma(auVar71,auVar164,auVar321);
            auVar322._8_4_ = 0x3eaaaaaa;
            auVar322._0_8_ = 0x3eaaaaaa3eaaaaaa;
            auVar322._12_4_ = 0x3eaaaaaa;
            auVar71 = vfmadd213ps_fma(auVar71,auVar164,auVar322);
            auVar308._0_4_ = auVar298._0_4_ * auVar164._0_4_ * auVar71._0_4_;
            auVar308._4_4_ = auVar298._4_4_ * auVar164._4_4_ * auVar71._4_4_;
            auVar308._8_4_ = auVar298._8_4_ * auVar164._8_4_ * auVar71._8_4_;
            auVar308._12_4_ = auVar298._12_4_ * auVar164._12_4_ * auVar71._12_4_;
            auVar71 = vfmadd231ps_fma(auVar308,auVar197,auVar248);
            auVar77 = vfmsub231ps_fma(auVar71,auVar330,auVar298);
            auVar71 = vcmpps_avx(auVar108,_DAT_004eb030,2);
            auVar77 = vsubps_avx(auVar77,auVar164);
            auVar197 = vfnmadd231ps_fma(auVar77,auVar346,auVar197);
            auVar165._0_4_ = auVar197._0_4_ + auVar197._0_4_;
            auVar165._4_4_ = auVar197._4_4_ + auVar197._4_4_;
            auVar165._8_4_ = auVar197._8_4_ + auVar197._8_4_;
            auVar165._12_4_ = auVar197._12_4_ + auVar197._12_4_;
            auVar198._8_4_ = 0x7fffffff;
            auVar198._0_8_ = 0x7fffffff7fffffff;
            auVar198._12_4_ = 0x7fffffff;
            auVar71 = vblendvps_avx(auVar165,auVar198,auVar71);
            auVar166._8_4_ = 0x42b0c0a5;
            auVar166._0_8_ = 0x42b0c0a542b0c0a5;
            auVar166._12_4_ = 0x42b0c0a5;
            auVar71 = vminps_avx(auVar71,auVar166);
            auVar77 = vmaxps_avx(auVar334,auVar71);
            auVar71 = vfmadd213ps_fma(auVar339,auVar77,auVar330);
            auVar199._0_4_ = (int)auVar71._0_4_;
            auVar199._4_4_ = (int)auVar71._4_4_;
            auVar199._8_4_ = (int)auVar71._8_4_;
            auVar199._12_4_ = (int)auVar71._12_4_;
            auVar197 = vcvtdq2ps_avx(auVar199);
            auVar71 = vcmpps_avx(auVar71,auVar197,1);
            auVar71 = vandps_avx(auVar71,auVar109);
            auVar71 = vsubps_avx(auVar197,auVar71);
            auVar197 = vfmsub231ps_fma(auVar77,auVar71,auVar346);
            auVar77 = vfnmsub231ps_fma(auVar197,auVar71,auVar248);
            auVar293 = ZEXT1664(auVar109);
            auVar200._0_4_ = auVar77._0_4_ * auVar77._0_4_;
            auVar200._4_4_ = auVar77._4_4_ * auVar77._4_4_;
            auVar200._8_4_ = auVar77._8_4_ * auVar77._8_4_;
            auVar200._12_4_ = auVar77._12_4_ * auVar77._12_4_;
            auVar197 = vfmadd213ps_fma(auVar357,auVar77,auVar352);
            auVar197 = vfmadd213ps_fma(auVar197,auVar77,auVar216);
            auVar50._8_4_ = 0x3d2aa9c1;
            auVar50._0_8_ = 0x3d2aa9c13d2aa9c1;
            auVar50._12_4_ = 0x3d2aa9c1;
            auVar197 = vfmadd213ps_fma(auVar197,auVar77,auVar50);
            auVar51._8_4_ = 0x3e2aaaaa;
            auVar51._0_8_ = 0x3e2aaaaa3e2aaaaa;
            auVar51._12_4_ = 0x3e2aaaaa;
            auVar197 = vfmadd213ps_fma(auVar197,auVar77,auVar51);
            auVar197 = vfmadd213ps_fma(auVar197,auVar77,auVar330);
            auVar68 = ZEXT864(0);
            auVar197 = vfmadd213ps_fma(auVar197,auVar200,auVar77);
            auVar201._0_4_ = auVar197._0_4_ + fVar48;
            auVar201._4_4_ = auVar197._4_4_ + fVar69;
            auVar201._8_4_ = auVar197._8_4_ + fVar4;
            auVar201._12_4_ = auVar197._12_4_ + fVar5;
            auVar112._0_4_ = (int)auVar71._0_4_;
            auVar112._4_4_ = (int)auVar71._4_4_;
            auVar112._8_4_ = (int)auVar71._8_4_;
            auVar112._12_4_ = (int)auVar71._12_4_;
            auVar71 = vpslld_avx(auVar112,0x17);
            auVar71 = vpaddd_avx(auVar71,auVar109);
            auVar109 = vfmadd213ps_fma(auVar71,auVar201,auVar109);
            auVar71 = vrcpps_avx(auVar109);
            auVar202._0_4_ = auVar71._0_4_ + auVar71._0_4_;
            auVar202._4_4_ = auVar71._4_4_ + auVar71._4_4_;
            auVar202._8_4_ = auVar71._8_4_ + auVar71._8_4_;
            auVar202._12_4_ = auVar71._12_4_ + auVar71._12_4_;
            auVar217._8_4_ = 0x40000000;
            auVar217._0_8_ = 0x4000000040000000;
            auVar217._12_4_ = 0x40000000;
            auVar109 = vfmsub213ps_fma(auVar109,auVar202,auVar217);
            auVar71 = vfnmadd213ps_fma(auVar109,auVar71,auVar202);
            auVar119 = vfmsub213ps_fma(auVar71,auVar74,auVar74);
            break;
          case 6:
            uVar2 = **(undefined4 **)(&this->field_0xe8 + (long)p_Var12);
            auVar118._4_4_ = uVar2;
            auVar118._0_4_ = uVar2;
            auVar118._8_4_ = uVar2;
            auVar118._12_4_ = uVar2;
            uVar2 = (*(undefined4 **)(&this->field_0xe8 + (long)p_Var12))[1];
            auVar172._4_4_ = uVar2;
            auVar172._0_4_ = uVar2;
            auVar172._8_4_ = uVar2;
            auVar172._12_4_ = uVar2;
            auVar197 = vfmadd231ps_fma(auVar172,auVar74,auVar118);
            auVar71 = vmaxps_avx(auVar197,auVar71);
            auVar71 = vminps_avx(auVar71,auVar109);
            auVar119._0_4_ = auVar71._0_4_ * auVar74._0_4_;
            auVar119._4_4_ = auVar71._4_4_ * auVar74._4_4_;
            auVar119._8_4_ = auVar71._8_4_ * auVar74._8_4_;
            auVar119._12_4_ = auVar71._12_4_ * auVar74._12_4_;
          }
        }
        *(undefined1 (*) [16])((long)top_blob->data + uVar28 * 0x10) = auVar119;
      }
    }
    else if (iVar36 == 8) {
      uVar44 = (ulong)uVar11;
      if ((int)uVar11 < 1) {
        uVar44 = 0;
      }
      for (uVar28 = 0; uVar28 != uVar44; uVar28 = uVar28 + 1) {
        auVar71 = ZEXT816(0) << 0x40;
        auVar68 = ZEXT1664(ZEXT816(0) << 0x40);
        if (lVar14 != 0) {
          auVar68 = ZEXT3264(*(undefined1 (*) [32])(lVar14 + uVar28 * 0x20));
        }
        pauVar29 = (undefined1 (*) [32])
                   ((long)(this->weight_data_tm).w * uVar28 * (this->weight_data_tm).elemsize +
                   (long)(this->weight_data_tm).data);
        lVar34 = 0;
        auVar53 = ZEXT816(0) << 0x40;
        auVar108 = ZEXT816(0) << 0x40;
        auVar73 = ZEXT816(0) << 0x40;
        auVar77 = ZEXT816(0) << 0x40;
        auVar197 = ZEXT816(0) << 0x40;
        auVar109 = ZEXT816(0) << 0x40;
        iVar36 = 0;
        pauVar30 = local_318;
        while( true ) {
          if (iVar33 <= iVar36 + 7) break;
          uVar2 = *(undefined4 *)*pauVar30;
          auVar341._4_4_ = uVar2;
          auVar341._0_4_ = uVar2;
          auVar341._8_4_ = uVar2;
          auVar341._12_4_ = uVar2;
          auVar341._16_4_ = uVar2;
          auVar341._20_4_ = uVar2;
          auVar341._24_4_ = uVar2;
          auVar341._28_4_ = uVar2;
          uVar2 = *(undefined4 *)(*pauVar30 + 4);
          auVar348._4_4_ = uVar2;
          auVar348._0_4_ = uVar2;
          auVar348._8_4_ = uVar2;
          auVar348._12_4_ = uVar2;
          auVar348._16_4_ = uVar2;
          auVar348._20_4_ = uVar2;
          auVar348._24_4_ = uVar2;
          auVar348._28_4_ = uVar2;
          uVar2 = *(undefined4 *)(*pauVar30 + 8);
          auVar324._4_4_ = uVar2;
          auVar324._0_4_ = uVar2;
          auVar324._8_4_ = uVar2;
          auVar324._12_4_ = uVar2;
          auVar324._16_4_ = uVar2;
          auVar324._20_4_ = uVar2;
          auVar324._24_4_ = uVar2;
          auVar324._28_4_ = uVar2;
          uVar2 = *(undefined4 *)(*pauVar30 + 0xc);
          auVar261._4_4_ = uVar2;
          auVar261._0_4_ = uVar2;
          auVar261._8_4_ = uVar2;
          auVar261._12_4_ = uVar2;
          auVar261._16_4_ = uVar2;
          auVar261._20_4_ = uVar2;
          auVar261._24_4_ = uVar2;
          auVar261._28_4_ = uVar2;
          auVar63 = vlddqu_avx(*pauVar29);
          auVar60 = vlddqu_avx(pauVar29[1]);
          auVar107 = vcvtph2ps_f16c(auVar63._0_16_);
          auVar63 = vcvtph2ps_f16c(auVar63._16_16_);
          auVar64 = vcvtph2ps_f16c(auVar60._0_16_);
          auVar60 = vcvtph2ps_f16c(auVar60._16_16_);
          auVar120 = vfmadd231ps_fma(auVar68._0_32_,auVar341,auVar107);
          auVar68 = ZEXT1664(auVar120);
          auVar109 = vfmadd231ps_fma(ZEXT1632(auVar109),auVar348,auVar63);
          auVar197 = vfmadd231ps_fma(ZEXT1632(auVar197),auVar324,auVar64);
          auVar77 = vfmadd231ps_fma(ZEXT1632(auVar77),auVar261,auVar60);
          uVar2 = *(undefined4 *)(*pauVar30 + 0x10);
          auVar182._4_4_ = uVar2;
          auVar182._0_4_ = uVar2;
          auVar182._8_4_ = uVar2;
          auVar182._12_4_ = uVar2;
          auVar182._16_4_ = uVar2;
          auVar182._20_4_ = uVar2;
          auVar182._24_4_ = uVar2;
          auVar182._28_4_ = uVar2;
          uVar2 = *(undefined4 *)(*pauVar30 + 0x14);
          auVar228._4_4_ = uVar2;
          auVar228._0_4_ = uVar2;
          auVar228._8_4_ = uVar2;
          auVar228._12_4_ = uVar2;
          auVar228._16_4_ = uVar2;
          auVar228._20_4_ = uVar2;
          auVar228._24_4_ = uVar2;
          auVar228._28_4_ = uVar2;
          uVar2 = *(undefined4 *)(*pauVar30 + 0x18);
          auVar262._4_4_ = uVar2;
          auVar262._0_4_ = uVar2;
          auVar262._8_4_ = uVar2;
          auVar262._12_4_ = uVar2;
          auVar262._16_4_ = uVar2;
          auVar262._20_4_ = uVar2;
          auVar262._24_4_ = uVar2;
          auVar262._28_4_ = uVar2;
          uVar2 = *(undefined4 *)(*pauVar30 + 0x1c);
          auVar301._4_4_ = uVar2;
          auVar301._0_4_ = uVar2;
          auVar301._8_4_ = uVar2;
          auVar301._12_4_ = uVar2;
          auVar301._16_4_ = uVar2;
          auVar301._20_4_ = uVar2;
          auVar301._24_4_ = uVar2;
          auVar301._28_4_ = uVar2;
          auVar63 = vlddqu_avx(pauVar29[2]);
          auVar60 = vlddqu_avx(pauVar29[3]);
          auVar107 = vcvtph2ps_f16c(auVar63._0_16_);
          auVar63 = vcvtph2ps_f16c(auVar63._16_16_);
          auVar64 = vcvtph2ps_f16c(auVar60._0_16_);
          auVar60 = vcvtph2ps_f16c(auVar60._16_16_);
          auVar73 = vfmadd231ps_fma(ZEXT1632(auVar73),auVar182,auVar107);
          auVar108 = vfmadd231ps_fma(ZEXT1632(auVar108),auVar228,auVar63);
          auVar53 = vfmadd231ps_fma(ZEXT1632(auVar53),auVar262,auVar64);
          auVar71 = vfmadd231ps_fma(ZEXT1632(auVar71),auVar301,auVar60);
          pauVar30 = pauVar30 + 1;
          pauVar29 = pauVar29 + 4;
          iVar36 = iVar36 + 8;
          lVar34 = lVar34 + 8;
        }
        for (; iVar36 + 3 < iVar33; iVar36 = iVar36 + 4) {
          uVar2 = *(undefined4 *)*pauVar30;
          auVar183._4_4_ = uVar2;
          auVar183._0_4_ = uVar2;
          auVar183._8_4_ = uVar2;
          auVar183._12_4_ = uVar2;
          auVar183._16_4_ = uVar2;
          auVar183._20_4_ = uVar2;
          auVar183._24_4_ = uVar2;
          auVar183._28_4_ = uVar2;
          uVar2 = *(undefined4 *)(*pauVar30 + 4);
          auVar229._4_4_ = uVar2;
          auVar229._0_4_ = uVar2;
          auVar229._8_4_ = uVar2;
          auVar229._12_4_ = uVar2;
          auVar229._16_4_ = uVar2;
          auVar229._20_4_ = uVar2;
          auVar229._24_4_ = uVar2;
          auVar229._28_4_ = uVar2;
          uVar2 = *(undefined4 *)(*pauVar30 + 8);
          auVar263._4_4_ = uVar2;
          auVar263._0_4_ = uVar2;
          auVar263._8_4_ = uVar2;
          auVar263._12_4_ = uVar2;
          auVar263._16_4_ = uVar2;
          auVar263._20_4_ = uVar2;
          auVar263._24_4_ = uVar2;
          auVar263._28_4_ = uVar2;
          uVar2 = *(undefined4 *)(*pauVar30 + 0xc);
          auVar302._4_4_ = uVar2;
          auVar302._0_4_ = uVar2;
          auVar302._8_4_ = uVar2;
          auVar302._12_4_ = uVar2;
          auVar302._16_4_ = uVar2;
          auVar302._20_4_ = uVar2;
          auVar302._24_4_ = uVar2;
          auVar302._28_4_ = uVar2;
          auVar63 = vlddqu_avx(*pauVar29);
          auVar60 = vlddqu_avx(pauVar29[1]);
          auVar107 = vcvtph2ps_f16c(auVar63._0_16_);
          auVar63 = vcvtph2ps_f16c(auVar63._16_16_);
          auVar64 = vcvtph2ps_f16c(auVar60._0_16_);
          auVar60 = vcvtph2ps_f16c(auVar60._16_16_);
          auVar120 = vfmadd231ps_fma(auVar68._0_32_,auVar183,auVar107);
          auVar68 = ZEXT1664(auVar120);
          auVar109 = vfmadd231ps_fma(ZEXT1632(auVar109),auVar229,auVar63);
          auVar197 = vfmadd231ps_fma(ZEXT1632(auVar197),auVar263,auVar64);
          auVar77 = vfmadd231ps_fma(ZEXT1632(auVar77),auVar302,auVar60);
          pauVar30 = (undefined1 (*) [32])(*pauVar30 + 0x10);
          pauVar29 = pauVar29 + 2;
          lVar34 = lVar34 + 4;
        }
        for (; (int)lVar34 < iVar33; lVar34 = lVar34 + 1) {
          uVar2 = *(undefined4 *)(*local_318 + lVar34 * 4);
          auVar184._4_4_ = uVar2;
          auVar184._0_4_ = uVar2;
          auVar184._8_4_ = uVar2;
          auVar184._12_4_ = uVar2;
          auVar184._16_4_ = uVar2;
          auVar184._20_4_ = uVar2;
          auVar184._24_4_ = uVar2;
          auVar184._28_4_ = uVar2;
          auVar120 = vlddqu_avx(*(undefined1 (*) [16])*pauVar29);
          auVar63 = vcvtph2ps_f16c(auVar120);
          auVar120 = vfmadd231ps_fma(auVar68._0_32_,auVar184,auVar63);
          auVar68 = ZEXT1664(auVar120);
          pauVar29 = (undefined1 (*) [32])(*pauVar29 + 0x10);
        }
        fVar48 = auVar71._0_4_ + auVar53._0_4_ + auVar108._0_4_ + auVar73._0_4_ +
                 auVar109._0_4_ + auVar77._0_4_ + auVar197._0_4_ + auVar68._0_4_;
        fVar69 = auVar71._4_4_ + auVar53._4_4_ + auVar108._4_4_ + auVar73._4_4_ +
                 auVar109._4_4_ + auVar77._4_4_ + auVar197._4_4_ + auVar68._4_4_;
        auVar58._0_8_ = CONCAT44(fVar69,fVar48);
        auVar58._8_4_ =
             auVar71._8_4_ + auVar53._8_4_ + auVar108._8_4_ + auVar73._8_4_ +
             auVar109._8_4_ + auVar77._8_4_ + auVar197._8_4_ + auVar68._8_4_;
        auVar58._12_4_ =
             auVar71._12_4_ + auVar53._12_4_ + auVar108._12_4_ + auVar73._12_4_ +
             auVar109._12_4_ + auVar77._12_4_ + auVar197._12_4_ + auVar68._12_4_;
        auVar58._16_4_ = auVar68._16_4_ + 0.0;
        auVar58._20_4_ = auVar68._20_4_ + 0.0;
        auVar58._24_4_ = auVar68._24_4_ + 0.0;
        auVar58._28_4_ = auVar68._28_4_ + 0.0;
        auVar63 = auVar58;
        if (5 < iVar27 - 1U) goto switchD_002adf3a_caseD_1;
        auVar63 = vmaxps_avx(auVar58,ZEXT832(0) << 0x20);
        switch(iVar27) {
        case 2:
          auVar60 = vminps_avx(auVar58,ZEXT832(0) << 0x20);
          uVar2 = **(undefined4 **)(&this->field_0xe8 + (long)p_Var12);
          auVar135._4_4_ = uVar2;
          auVar135._0_4_ = uVar2;
          auVar135._8_4_ = uVar2;
          auVar135._12_4_ = uVar2;
          auVar135._16_4_ = uVar2;
          auVar135._20_4_ = uVar2;
          auVar135._24_4_ = uVar2;
          auVar135._28_4_ = uVar2;
          auVar71 = vfmadd231ps_fma(auVar63,auVar60,auVar135);
          auVar63 = ZEXT1632(auVar71);
          break;
        case 3:
          uVar2 = **(undefined4 **)(&this->field_0xe8 + (long)p_Var12);
          auVar92._4_4_ = uVar2;
          auVar92._0_4_ = uVar2;
          auVar92._8_4_ = uVar2;
          auVar92._12_4_ = uVar2;
          auVar92._16_4_ = uVar2;
          auVar92._20_4_ = uVar2;
          auVar92._24_4_ = uVar2;
          auVar92._28_4_ = uVar2;
          uVar2 = (*(undefined4 **)(&this->field_0xe8 + (long)p_Var12))[1];
          auVar144._4_4_ = uVar2;
          auVar144._0_4_ = uVar2;
          auVar144._8_4_ = uVar2;
          auVar144._12_4_ = uVar2;
          auVar144._16_4_ = uVar2;
          auVar144._20_4_ = uVar2;
          auVar144._24_4_ = uVar2;
          auVar144._28_4_ = uVar2;
          auVar63 = vmaxps_avx(auVar58,auVar92);
          auVar63 = vminps_avx(auVar63,auVar144);
          break;
        case 4:
          auVar59._0_8_ = auVar58._0_8_ ^ 0x8000000080000000;
          auVar59._8_4_ = -auVar58._8_4_;
          auVar59._12_4_ = -auVar58._12_4_;
          auVar59._16_4_ = -auVar58._16_4_;
          auVar59._20_4_ = -auVar58._20_4_;
          auVar59._24_4_ = -auVar58._24_4_;
          auVar59._28_4_ = -auVar58._28_4_;
          auVar93._8_4_ = 0x42b0c0a5;
          auVar93._0_8_ = 0x42b0c0a542b0c0a5;
          auVar93._12_4_ = 0x42b0c0a5;
          auVar93._16_4_ = 0x42b0c0a5;
          auVar93._20_4_ = 0x42b0c0a5;
          auVar93._24_4_ = 0x42b0c0a5;
          auVar93._28_4_ = 0x42b0c0a5;
          auVar63 = vminps_avx(auVar59,auVar93);
          auVar94._8_4_ = 0xc2b0c0a5;
          auVar94._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar94._12_4_ = 0xc2b0c0a5;
          auVar94._16_4_ = 0xc2b0c0a5;
          auVar94._20_4_ = 0xc2b0c0a5;
          auVar94._24_4_ = 0xc2b0c0a5;
          auVar94._28_4_ = 0xc2b0c0a5;
          auVar60 = vmaxps_avx(auVar63,auVar94);
          auVar95._8_4_ = 0x3fb8aa3b;
          auVar95._0_8_ = 0x3fb8aa3b3fb8aa3b;
          auVar95._12_4_ = 0x3fb8aa3b;
          auVar95._16_4_ = 0x3fb8aa3b;
          auVar95._20_4_ = 0x3fb8aa3b;
          auVar95._24_4_ = 0x3fb8aa3b;
          auVar95._28_4_ = 0x3fb8aa3b;
          auVar211._8_4_ = 0x3f000000;
          auVar211._0_8_ = 0x3f0000003f000000;
          auVar211._12_4_ = 0x3f000000;
          auVar211._16_4_ = 0x3f000000;
          auVar211._20_4_ = 0x3f000000;
          auVar211._24_4_ = 0x3f000000;
          auVar211._28_4_ = 0x3f000000;
          auVar71 = vfmadd213ps_fma(auVar95,auVar60,auVar211);
          auVar107 = vroundps_avx(ZEXT1632(auVar71),1);
          auVar63 = vcmpps_avx(ZEXT1632(auVar71),auVar107,1);
          auVar237._8_4_ = 0x3f800000;
          auVar237._0_8_ = 0x3f8000003f800000;
          auVar237._12_4_ = 0x3f800000;
          auVar237._16_4_ = 0x3f800000;
          auVar237._20_4_ = 0x3f800000;
          auVar237._24_4_ = 0x3f800000;
          auVar237._28_4_ = 0x3f800000;
          auVar63 = vandps_avx(auVar63,auVar237);
          auVar63 = vsubps_avx(auVar107,auVar63);
          auVar145._8_4_ = 0x3f318000;
          auVar145._0_8_ = 0x3f3180003f318000;
          auVar145._12_4_ = 0x3f318000;
          auVar145._16_4_ = 0x3f318000;
          auVar145._20_4_ = 0x3f318000;
          auVar145._24_4_ = 0x3f318000;
          auVar145._28_4_ = 0x3f318000;
          auVar71 = vfmsub231ps_fma(auVar60,auVar63,auVar145);
          auVar146._8_4_ = 0x395e8083;
          auVar146._0_8_ = 0x395e8083395e8083;
          auVar146._12_4_ = 0x395e8083;
          auVar146._16_4_ = 0x395e8083;
          auVar146._20_4_ = 0x395e8083;
          auVar146._24_4_ = 0x395e8083;
          auVar146._28_4_ = 0x395e8083;
          auVar109 = vfmsub231ps_fma(ZEXT1632(auVar71),auVar63,auVar146);
          auVar60 = ZEXT1632(auVar109);
          auVar19._28_4_ = 0x395e8083;
          auVar19._0_28_ =
               ZEXT1628(CONCAT412(auVar109._12_4_ * auVar109._12_4_,
                                  CONCAT48(auVar109._8_4_ * auVar109._8_4_,
                                           CONCAT44(auVar109._4_4_ * auVar109._4_4_,
                                                    auVar109._0_4_ * auVar109._0_4_))));
          auVar188._8_4_ = 0x39506967;
          auVar188._0_8_ = 0x3950696739506967;
          auVar188._12_4_ = 0x39506967;
          auVar188._16_4_ = 0x39506967;
          auVar188._20_4_ = 0x39506967;
          auVar188._24_4_ = 0x39506967;
          auVar188._28_4_ = 0x39506967;
          auVar274._8_4_ = 0x3ab743ce;
          auVar274._0_8_ = 0x3ab743ce3ab743ce;
          auVar274._12_4_ = 0x3ab743ce;
          auVar274._16_4_ = 0x3ab743ce;
          auVar274._20_4_ = 0x3ab743ce;
          auVar274._24_4_ = 0x3ab743ce;
          auVar274._28_4_ = 0x3ab743ce;
          auVar71 = vfmadd213ps_fma(auVar188,auVar60,auVar274);
          auVar275._8_4_ = 0x3c088908;
          auVar275._0_8_ = 0x3c0889083c088908;
          auVar275._12_4_ = 0x3c088908;
          auVar275._16_4_ = 0x3c088908;
          auVar275._20_4_ = 0x3c088908;
          auVar275._24_4_ = 0x3c088908;
          auVar275._28_4_ = 0x3c088908;
          auVar71 = vfmadd213ps_fma(ZEXT1632(auVar71),auVar60,auVar275);
          auVar276._8_4_ = 0x3d2aa9c1;
          auVar276._0_8_ = 0x3d2aa9c13d2aa9c1;
          auVar276._12_4_ = 0x3d2aa9c1;
          auVar276._16_4_ = 0x3d2aa9c1;
          auVar276._20_4_ = 0x3d2aa9c1;
          auVar276._24_4_ = 0x3d2aa9c1;
          auVar276._28_4_ = 0x3d2aa9c1;
          auVar71 = vfmadd213ps_fma(ZEXT1632(auVar71),auVar60,auVar276);
          auVar277._8_4_ = 0x3e2aaaaa;
          auVar277._0_8_ = 0x3e2aaaaa3e2aaaaa;
          auVar277._12_4_ = 0x3e2aaaaa;
          auVar277._16_4_ = 0x3e2aaaaa;
          auVar277._20_4_ = 0x3e2aaaaa;
          auVar277._24_4_ = 0x3e2aaaaa;
          auVar277._28_4_ = 0x3e2aaaaa;
          auVar60 = ZEXT1632(auVar109);
          auVar71 = vfmadd213ps_fma(ZEXT1632(auVar71),auVar60,auVar277);
          auVar71 = vfmadd213ps_fma(ZEXT1632(auVar71),auVar60,auVar211);
          auVar197 = vfmadd213ps_fma(ZEXT1632(auVar71),auVar19,auVar60);
          auVar49._0_4_ = (int)auVar63._0_4_;
          auVar49._4_4_ = (int)auVar63._4_4_;
          auVar49._8_4_ = (int)auVar63._8_4_;
          auVar49._12_4_ = (int)auVar63._12_4_;
          auVar61._16_4_ = (int)auVar63._16_4_;
          auVar61._0_16_ = auVar49;
          auVar61._20_4_ = (int)auVar63._20_4_;
          auVar61._24_4_ = (int)auVar63._24_4_;
          auVar61._28_4_ = (int)auVar63._28_4_;
          auVar109 = vpslld_avx(auVar49,0x17);
          auVar71 = vpslld_avx(auVar61._16_16_,0x17);
          auVar110._8_4_ = 0x3f800000;
          auVar110._0_8_ = 0x3f8000003f800000;
          auVar110._12_4_ = 0x3f800000;
          auVar71 = vpaddd_avx(auVar71,auVar110);
          auVar109 = vpaddd_avx(auVar109,auVar110);
          auVar96._16_16_ = auVar71;
          auVar96._0_16_ = auVar109;
          auVar62._0_4_ = auVar197._0_4_ + 1.0;
          auVar62._4_4_ = auVar197._4_4_ + 1.0;
          auVar62._8_4_ = auVar197._8_4_ + 1.0;
          auVar62._12_4_ = auVar197._12_4_ + 1.0;
          auVar62._16_4_ = 0x3f800000;
          auVar62._20_4_ = 0x3f800000;
          auVar62._24_4_ = 0x3f800000;
          auVar62._28_4_ = 0x3f800000;
          auVar71 = vfmadd213ps_fma(auVar96,auVar62,auVar237);
          auVar63 = vrcpps_avx(ZEXT1632(auVar71));
          auVar71 = vfmsub213ps_fma(ZEXT1632(auVar71),auVar63,auVar237);
          auVar71 = vfnmadd132ps_fma(ZEXT1632(auVar71),auVar63,auVar63);
          auVar63 = ZEXT1632(auVar71);
          break;
        case 5:
          auVar303._8_4_ = 0x42b0c0a5;
          auVar303._0_8_ = 0x42b0c0a542b0c0a5;
          auVar303._12_4_ = 0x42b0c0a5;
          auVar303._16_4_ = 0x42b0c0a5;
          auVar303._20_4_ = 0x42b0c0a5;
          auVar303._24_4_ = 0x42b0c0a5;
          auVar303._28_4_ = 0x42b0c0a5;
          auVar63 = vminps_avx(auVar58,auVar303);
          auVar311._8_4_ = 0xc2b0c0a5;
          auVar311._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar311._12_4_ = 0xc2b0c0a5;
          auVar311._16_4_ = 0xc2b0c0a5;
          auVar311._20_4_ = 0xc2b0c0a5;
          auVar311._24_4_ = 0xc2b0c0a5;
          auVar311._28_4_ = 0xc2b0c0a5;
          auVar60 = vmaxps_avx(auVar311,auVar63);
          auVar136._8_4_ = 0x3fb8aa3b;
          auVar136._0_8_ = 0x3fb8aa3b3fb8aa3b;
          auVar136._12_4_ = 0x3fb8aa3b;
          auVar136._16_4_ = 0x3fb8aa3b;
          auVar136._20_4_ = 0x3fb8aa3b;
          auVar136._24_4_ = 0x3fb8aa3b;
          auVar136._28_4_ = 0x3fb8aa3b;
          auVar325._8_4_ = 0x3f000000;
          auVar325._0_8_ = 0x3f0000003f000000;
          auVar325._12_4_ = 0x3f000000;
          auVar325._16_4_ = 0x3f000000;
          auVar325._20_4_ = 0x3f000000;
          auVar325._24_4_ = 0x3f000000;
          auVar325._28_4_ = 0x3f000000;
          auVar71 = vfmadd213ps_fma(auVar136,auVar60,auVar325);
          auVar107 = vroundps_avx(ZEXT1632(auVar71),1);
          auVar63 = vcmpps_avx(ZEXT1632(auVar71),auVar107,1);
          auVar336._8_4_ = 0x3f800000;
          auVar336._0_8_ = 0x3f8000003f800000;
          auVar336._12_4_ = 0x3f800000;
          auVar336._16_4_ = 0x3f800000;
          auVar336._20_4_ = 0x3f800000;
          auVar336._24_4_ = 0x3f800000;
          auVar336._28_4_ = 0x3f800000;
          auVar63 = vandps_avx(auVar336,auVar63);
          auVar63 = vsubps_avx(auVar107,auVar63);
          auVar342._8_4_ = 0x3f318000;
          auVar342._0_8_ = 0x3f3180003f318000;
          auVar342._12_4_ = 0x3f318000;
          auVar342._16_4_ = 0x3f318000;
          auVar342._20_4_ = 0x3f318000;
          auVar342._24_4_ = 0x3f318000;
          auVar342._28_4_ = 0x3f318000;
          auVar71 = vfmsub231ps_fma(auVar60,auVar63,auVar342);
          auVar312._8_4_ = 0xb95e8083;
          auVar312._0_8_ = 0xb95e8083b95e8083;
          auVar312._12_4_ = 0xb95e8083;
          auVar312._16_4_ = 0xb95e8083;
          auVar312._20_4_ = 0xb95e8083;
          auVar312._24_4_ = 0xb95e8083;
          auVar312._28_4_ = 0xb95e8083;
          auVar109 = vfnmsub231ps_fma(ZEXT1632(auVar71),auVar63,auVar312);
          auVar60 = ZEXT1632(auVar109);
          auVar17._28_4_ = auVar107._28_4_;
          auVar17._0_28_ =
               ZEXT1628(CONCAT412(auVar109._12_4_ * auVar109._12_4_,
                                  CONCAT48(auVar109._8_4_ * auVar109._8_4_,
                                           CONCAT44(auVar109._4_4_ * auVar109._4_4_,
                                                    auVar109._0_4_ * auVar109._0_4_))));
          auVar354._8_4_ = 0x39506967;
          auVar354._0_8_ = 0x3950696739506967;
          auVar354._12_4_ = 0x39506967;
          auVar354._16_4_ = 0x39506967;
          auVar354._20_4_ = 0x39506967;
          auVar354._24_4_ = 0x39506967;
          auVar354._28_4_ = 0x39506967;
          auVar349._8_4_ = 0x3ab743ce;
          auVar349._0_8_ = 0x3ab743ce3ab743ce;
          auVar349._12_4_ = 0x3ab743ce;
          auVar349._16_4_ = 0x3ab743ce;
          auVar349._20_4_ = 0x3ab743ce;
          auVar349._24_4_ = 0x3ab743ce;
          auVar349._28_4_ = 0x3ab743ce;
          auVar71 = vfmadd213ps_fma(auVar354,auVar60,auVar349);
          auVar359._8_4_ = 0x3c088908;
          auVar359._0_8_ = 0x3c0889083c088908;
          auVar359._12_4_ = 0x3c088908;
          auVar359._16_4_ = 0x3c088908;
          auVar359._20_4_ = 0x3c088908;
          auVar359._24_4_ = 0x3c088908;
          auVar359._28_4_ = 0x3c088908;
          auVar71 = vfmadd213ps_fma(ZEXT1632(auVar71),auVar60,auVar359);
          auVar230._8_4_ = 0x3d2aa9c1;
          auVar230._0_8_ = 0x3d2aa9c13d2aa9c1;
          auVar230._12_4_ = 0x3d2aa9c1;
          auVar230._16_4_ = 0x3d2aa9c1;
          auVar230._20_4_ = 0x3d2aa9c1;
          auVar230._24_4_ = 0x3d2aa9c1;
          auVar230._28_4_ = 0x3d2aa9c1;
          auVar71 = vfmadd213ps_fma(ZEXT1632(auVar71),auVar60,auVar230);
          auVar231._8_4_ = 0x3e2aaaaa;
          auVar231._0_8_ = 0x3e2aaaaa3e2aaaaa;
          auVar231._12_4_ = 0x3e2aaaaa;
          auVar231._16_4_ = 0x3e2aaaaa;
          auVar231._20_4_ = 0x3e2aaaaa;
          auVar231._24_4_ = 0x3e2aaaaa;
          auVar231._28_4_ = 0x3e2aaaaa;
          auVar60 = ZEXT1632(auVar109);
          auVar71 = vfmadd213ps_fma(ZEXT1632(auVar71),auVar60,auVar231);
          auVar71 = vfmadd213ps_fma(ZEXT1632(auVar71),auVar60,auVar325);
          auVar71 = vfmadd213ps_fma(ZEXT1632(auVar71),auVar17,auVar60);
          auVar185._0_4_ = auVar71._0_4_ + 1.0;
          auVar185._4_4_ = auVar71._4_4_ + 1.0;
          auVar185._8_4_ = auVar71._8_4_ + 1.0;
          auVar185._12_4_ = auVar71._12_4_ + 1.0;
          auVar185._16_4_ = 0x3f800000;
          auVar185._20_4_ = 0x3f800000;
          auVar185._24_4_ = 0x3f800000;
          auVar185._28_4_ = 0x3f800000;
          auVar70._0_4_ = (int)auVar63._0_4_;
          auVar70._4_4_ = (int)auVar63._4_4_;
          auVar70._8_4_ = (int)auVar63._8_4_;
          auVar70._12_4_ = (int)auVar63._12_4_;
          auVar88._16_4_ = (int)auVar63._16_4_;
          auVar88._0_16_ = auVar70;
          auVar88._20_4_ = (int)auVar63._20_4_;
          auVar88._24_4_ = (int)auVar63._24_4_;
          auVar88._28_4_ = (int)auVar63._28_4_;
          auVar109 = vpslld_avx(auVar70,0x17);
          auVar71 = vpslld_avx(auVar88._16_16_,0x17);
          auVar294._8_4_ = 0x3f800000;
          auVar294._0_8_ = 0x3f8000003f800000;
          auVar294._12_4_ = 0x3f800000;
          auVar71 = vpaddd_avx(auVar71,auVar294);
          auVar109 = vpaddd_avx(auVar109,auVar294);
          auVar89._16_16_ = auVar71;
          auVar89._0_16_ = auVar109;
          auVar197 = vfmadd213ps_fma(auVar89,auVar185,auVar336);
          auVar137._8_4_ = 0x800000;
          auVar137._0_8_ = 0x80000000800000;
          auVar137._12_4_ = 0x800000;
          auVar137._16_4_ = 0x800000;
          auVar137._20_4_ = 0x800000;
          auVar137._24_4_ = 0x800000;
          auVar137._28_4_ = 0x800000;
          auVar63 = vmaxps_avx(ZEXT1632(auVar197),auVar137);
          auVar109 = vpsrld_avx(auVar63._0_16_,0x17);
          auVar71 = vpsrld_avx(auVar63._16_16_,0x17);
          auVar232._8_4_ = 0x807fffff;
          auVar232._0_8_ = 0x807fffff807fffff;
          auVar232._12_4_ = 0x807fffff;
          auVar232._16_4_ = 0x807fffff;
          auVar232._20_4_ = 0x807fffff;
          auVar232._24_4_ = 0x807fffff;
          auVar232._28_4_ = 0x807fffff;
          auVar63 = vandps_avx(auVar63,auVar232);
          auVar107 = vorps_avx(auVar325,auVar63);
          auVar233._8_4_ = 0x3f3504f3;
          auVar233._0_8_ = 0x3f3504f33f3504f3;
          auVar233._12_4_ = 0x3f3504f3;
          auVar233._16_4_ = 0x3f3504f3;
          auVar233._20_4_ = 0x3f3504f3;
          auVar233._24_4_ = 0x3f3504f3;
          auVar233._28_4_ = 0x3f3504f3;
          auVar60 = vcmpps_avx(auVar233,auVar107,2);
          auVar63 = vandnps_avx(auVar60,auVar107);
          auVar332._8_4_ = 0xbf800000;
          auVar332._0_8_ = 0xbf800000bf800000;
          auVar332._12_4_ = 0xbf800000;
          auVar332._16_4_ = 0xbf800000;
          auVar332._20_4_ = 0xbf800000;
          auVar332._24_4_ = 0xbf800000;
          auVar332._28_4_ = 0xbf800000;
          auVar138._0_4_ = auVar107._0_4_ + -1.0 + auVar63._0_4_;
          auVar138._4_4_ = auVar107._4_4_ + -1.0 + auVar63._4_4_;
          auVar138._8_4_ = auVar107._8_4_ + -1.0 + auVar63._8_4_;
          auVar138._12_4_ = auVar107._12_4_ + -1.0 + auVar63._12_4_;
          auVar138._16_4_ = auVar107._16_4_ + -1.0 + auVar63._16_4_;
          auVar138._20_4_ = auVar107._20_4_ + -1.0 + auVar63._20_4_;
          auVar138._24_4_ = auVar107._24_4_ + -1.0 + auVar63._24_4_;
          auVar138._28_4_ = auVar107._28_4_ + -1.0 + auVar63._28_4_;
          auVar71 = vpsubd_avx(auVar71,auVar60._16_16_);
          auVar247._8_4_ = 0xffffff81;
          auVar247._0_8_ = 0xffffff81ffffff81;
          auVar247._12_4_ = 0xffffff81;
          auVar71 = vpaddd_avx(auVar71,auVar247);
          auVar109 = vpsubd_avx(auVar109,auVar60._0_16_);
          auVar109 = vpaddd_avx(auVar109,auVar247);
          auVar186._16_16_ = auVar71;
          auVar186._0_16_ = auVar109;
          auVar210._0_4_ = auVar138._0_4_ * auVar138._0_4_;
          auVar210._4_4_ = auVar138._4_4_ * auVar138._4_4_;
          auVar210._8_4_ = auVar138._8_4_ * auVar138._8_4_;
          auVar210._12_4_ = auVar138._12_4_ * auVar138._12_4_;
          auVar210._16_4_ = auVar138._16_4_ * auVar138._16_4_;
          auVar210._20_4_ = auVar138._20_4_ * auVar138._20_4_;
          auVar210._24_4_ = auVar138._24_4_ * auVar138._24_4_;
          auVar210._28_4_ = 0;
          auVar234._8_4_ = 0x3d9021bb;
          auVar234._0_8_ = 0x3d9021bb3d9021bb;
          auVar234._12_4_ = 0x3d9021bb;
          auVar234._16_4_ = 0x3d9021bb;
          auVar234._20_4_ = 0x3d9021bb;
          auVar234._24_4_ = 0x3d9021bb;
          auVar234._28_4_ = 0x3d9021bb;
          auVar264._8_4_ = 0xbdebd1b8;
          auVar264._0_8_ = 0xbdebd1b8bdebd1b8;
          auVar264._12_4_ = 0xbdebd1b8;
          auVar264._16_4_ = 0xbdebd1b8;
          auVar264._20_4_ = 0xbdebd1b8;
          auVar264._24_4_ = 0xbdebd1b8;
          auVar264._28_4_ = 0xbdebd1b8;
          auVar71 = vfmadd213ps_fma(auVar234,auVar138,auVar264);
          auVar265._8_4_ = 0x3def251a;
          auVar265._0_8_ = 0x3def251a3def251a;
          auVar265._12_4_ = 0x3def251a;
          auVar265._16_4_ = 0x3def251a;
          auVar265._20_4_ = 0x3def251a;
          auVar265._24_4_ = 0x3def251a;
          auVar265._28_4_ = 0x3def251a;
          auVar71 = vfmadd213ps_fma(ZEXT1632(auVar71),auVar138,auVar265);
          auVar266._8_4_ = 0xbdfe5d4f;
          auVar266._0_8_ = 0xbdfe5d4fbdfe5d4f;
          auVar266._12_4_ = 0xbdfe5d4f;
          auVar266._16_4_ = 0xbdfe5d4f;
          auVar266._20_4_ = 0xbdfe5d4f;
          auVar266._24_4_ = 0xbdfe5d4f;
          auVar266._28_4_ = 0xbdfe5d4f;
          auVar71 = vfmadd213ps_fma(ZEXT1632(auVar71),auVar138,auVar266);
          auVar267._8_4_ = 0x3e11e9bf;
          auVar267._0_8_ = 0x3e11e9bf3e11e9bf;
          auVar267._12_4_ = 0x3e11e9bf;
          auVar267._16_4_ = 0x3e11e9bf;
          auVar267._20_4_ = 0x3e11e9bf;
          auVar267._24_4_ = 0x3e11e9bf;
          auVar267._28_4_ = 0x3e11e9bf;
          auVar71 = vfmadd213ps_fma(ZEXT1632(auVar71),auVar138,auVar267);
          auVar268._8_4_ = 0xbe2aae50;
          auVar268._0_8_ = 0xbe2aae50be2aae50;
          auVar268._12_4_ = 0xbe2aae50;
          auVar268._16_4_ = 0xbe2aae50;
          auVar268._20_4_ = 0xbe2aae50;
          auVar268._24_4_ = 0xbe2aae50;
          auVar268._28_4_ = 0xbe2aae50;
          auVar71 = vfmadd213ps_fma(ZEXT1632(auVar71),auVar138,auVar268);
          auVar269._8_4_ = 0x3e4cceac;
          auVar269._0_8_ = 0x3e4cceac3e4cceac;
          auVar269._12_4_ = 0x3e4cceac;
          auVar269._16_4_ = 0x3e4cceac;
          auVar269._20_4_ = 0x3e4cceac;
          auVar269._24_4_ = 0x3e4cceac;
          auVar269._28_4_ = 0x3e4cceac;
          auVar71 = vfmadd213ps_fma(ZEXT1632(auVar71),auVar138,auVar269);
          auVar270._8_4_ = 0xbe7ffffc;
          auVar270._0_8_ = 0xbe7ffffcbe7ffffc;
          auVar270._12_4_ = 0xbe7ffffc;
          auVar270._16_4_ = 0xbe7ffffc;
          auVar270._20_4_ = 0xbe7ffffc;
          auVar270._24_4_ = 0xbe7ffffc;
          auVar270._28_4_ = 0xbe7ffffc;
          auVar71 = vfmadd213ps_fma(ZEXT1632(auVar71),auVar138,auVar270);
          auVar271._8_4_ = 0x3eaaaaaa;
          auVar271._0_8_ = 0x3eaaaaaa3eaaaaaa;
          auVar271._12_4_ = 0x3eaaaaaa;
          auVar271._16_4_ = 0x3eaaaaaa;
          auVar271._20_4_ = 0x3eaaaaaa;
          auVar271._24_4_ = 0x3eaaaaaa;
          auVar271._28_4_ = 0x3eaaaaaa;
          auVar71 = vfmadd213ps_fma(ZEXT1632(auVar71),auVar138,auVar271);
          auVar235._0_4_ = auVar210._0_4_ * auVar138._0_4_ * auVar71._0_4_;
          auVar235._4_4_ = auVar210._4_4_ * auVar138._4_4_ * auVar71._4_4_;
          auVar235._8_4_ = auVar210._8_4_ * auVar138._8_4_ * auVar71._8_4_;
          auVar235._12_4_ = auVar210._12_4_ * auVar138._12_4_ * auVar71._12_4_;
          auVar235._16_4_ = auVar210._16_4_ * auVar138._16_4_ * 0.0;
          auVar235._20_4_ = auVar210._20_4_ * auVar138._20_4_ * 0.0;
          auVar235._24_4_ = auVar210._24_4_ * auVar138._24_4_ * 0.0;
          auVar235._28_4_ = 0;
          auVar60 = vcvtdq2ps_avx(auVar186);
          auVar71 = vfmadd231ps_fma(auVar235,auVar60,auVar312);
          auVar71 = vfmsub231ps_fma(ZEXT1632(auVar71),auVar325,auVar210);
          auVar63 = vcmpps_avx(ZEXT1632(auVar197),ZEXT432(0) << 0x20,2);
          auVar107 = vsubps_avx(ZEXT1632(auVar71),auVar138);
          auVar71 = vfmsub231ps_fma(auVar107,auVar342,auVar60);
          auVar236._8_4_ = 0xc0000000;
          auVar236._0_8_ = 0xc0000000c0000000;
          auVar236._12_4_ = 0xc0000000;
          auVar236._16_4_ = 0xc0000000;
          auVar236._20_4_ = 0xc0000000;
          auVar236._24_4_ = 0xc0000000;
          auVar236._28_4_ = 0xc0000000;
          auVar139._0_4_ = auVar71._0_4_ * -2.0;
          auVar139._4_4_ = auVar71._4_4_ * -2.0;
          auVar139._8_4_ = auVar71._8_4_ * -2.0;
          auVar139._12_4_ = auVar71._12_4_ * -2.0;
          auVar139._16_4_ = 0x80000000;
          auVar139._20_4_ = 0x80000000;
          auVar139._24_4_ = 0x80000000;
          auVar139._28_4_ = 0;
          auVar187._8_4_ = 0x7fffffff;
          auVar187._0_8_ = 0x7fffffff7fffffff;
          auVar187._12_4_ = 0x7fffffff;
          auVar187._16_4_ = 0x7fffffff;
          auVar187._20_4_ = 0x7fffffff;
          auVar187._24_4_ = 0x7fffffff;
          auVar187._28_4_ = 0x7fffffff;
          auVar63 = vblendvps_avx(auVar139,auVar187,auVar63);
          auVar140._8_4_ = 0x42b0c0a5;
          auVar140._0_8_ = 0x42b0c0a542b0c0a5;
          auVar140._12_4_ = 0x42b0c0a5;
          auVar140._16_4_ = 0x42b0c0a5;
          auVar140._20_4_ = 0x42b0c0a5;
          auVar140._24_4_ = 0x42b0c0a5;
          auVar140._28_4_ = 0x42b0c0a5;
          auVar63 = vminps_avx(auVar63,auVar140);
          auVar141._8_4_ = 0xc2b0c0a5;
          auVar141._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar141._12_4_ = 0xc2b0c0a5;
          auVar141._16_4_ = 0xc2b0c0a5;
          auVar141._20_4_ = 0xc2b0c0a5;
          auVar141._24_4_ = 0xc2b0c0a5;
          auVar141._28_4_ = 0xc2b0c0a5;
          auVar60 = vmaxps_avx(auVar63,auVar141);
          auVar142._8_4_ = 0x3fb8aa3b;
          auVar142._0_8_ = 0x3fb8aa3b3fb8aa3b;
          auVar142._12_4_ = 0x3fb8aa3b;
          auVar142._16_4_ = 0x3fb8aa3b;
          auVar142._20_4_ = 0x3fb8aa3b;
          auVar142._24_4_ = 0x3fb8aa3b;
          auVar142._28_4_ = 0x3fb8aa3b;
          auVar71 = vfmadd213ps_fma(auVar142,auVar60,auVar325);
          auVar107 = vroundps_avx(ZEXT1632(auVar71),1);
          auVar63 = vcmpps_avx(ZEXT1632(auVar71),auVar107,1);
          auVar63 = vandps_avx(auVar336,auVar63);
          auVar63 = vsubps_avx(auVar107,auVar63);
          auVar71 = vfmsub231ps_fma(auVar60,auVar63,auVar342);
          auVar109 = vfnmsub231ps_fma(ZEXT1632(auVar71),auVar63,auVar312);
          auVar60 = ZEXT1632(auVar109);
          auVar18._28_4_ = auVar107._28_4_;
          auVar18._0_28_ =
               ZEXT1628(CONCAT412(auVar109._12_4_ * auVar109._12_4_,
                                  CONCAT48(auVar109._8_4_ * auVar109._8_4_,
                                           CONCAT44(auVar109._4_4_ * auVar109._4_4_,
                                                    auVar109._0_4_ * auVar109._0_4_))));
          auVar71 = vfmadd213ps_fma(auVar354,auVar60,auVar349);
          auVar71 = vfmadd213ps_fma(ZEXT1632(auVar71),auVar60,auVar359);
          auVar272._8_4_ = 0x3d2aa9c1;
          auVar272._0_8_ = 0x3d2aa9c13d2aa9c1;
          auVar272._12_4_ = 0x3d2aa9c1;
          auVar272._16_4_ = 0x3d2aa9c1;
          auVar272._20_4_ = 0x3d2aa9c1;
          auVar272._24_4_ = 0x3d2aa9c1;
          auVar272._28_4_ = 0x3d2aa9c1;
          auVar71 = vfmadd213ps_fma(ZEXT1632(auVar71),auVar60,auVar272);
          auVar273._8_4_ = 0x3e2aaaaa;
          auVar273._0_8_ = 0x3e2aaaaa3e2aaaaa;
          auVar273._12_4_ = 0x3e2aaaaa;
          auVar273._16_4_ = 0x3e2aaaaa;
          auVar273._20_4_ = 0x3e2aaaaa;
          auVar273._24_4_ = 0x3e2aaaaa;
          auVar273._28_4_ = 0x3e2aaaaa;
          auVar60 = ZEXT1632(auVar109);
          auVar71 = vfmadd213ps_fma(ZEXT1632(auVar71),auVar60,auVar273);
          auVar71 = vfmadd213ps_fma(ZEXT1632(auVar71),auVar60,auVar325);
          auVar197 = vfmadd213ps_fma(ZEXT1632(auVar71),auVar18,auVar60);
          auVar72._0_4_ = (int)auVar63._0_4_;
          auVar72._4_4_ = (int)auVar63._4_4_;
          auVar72._8_4_ = (int)auVar63._8_4_;
          auVar72._12_4_ = (int)auVar63._12_4_;
          auVar90._16_4_ = (int)auVar63._16_4_;
          auVar90._0_16_ = auVar72;
          auVar90._20_4_ = (int)auVar63._20_4_;
          auVar90._24_4_ = (int)auVar63._24_4_;
          auVar90._28_4_ = (int)auVar63._28_4_;
          auVar109 = vpslld_avx(auVar72,0x17);
          auVar71 = vpslld_avx(auVar90._16_16_,0x17);
          auVar71 = vpaddd_avx(auVar71,auVar294);
          auVar109 = vpaddd_avx(auVar109,auVar294);
          auVar91._16_16_ = auVar71;
          auVar91._0_16_ = auVar109;
          auVar143._0_4_ = auVar197._0_4_ + 1.0;
          auVar143._4_4_ = auVar197._4_4_ + 1.0;
          auVar143._8_4_ = auVar197._8_4_ + 1.0;
          auVar143._12_4_ = auVar197._12_4_ + 1.0;
          auVar143._16_4_ = 0x3f800000;
          auVar143._20_4_ = 0x3f800000;
          auVar143._24_4_ = 0x3f800000;
          auVar143._28_4_ = 0x3f800000;
          auVar71 = vfmadd213ps_fma(auVar91,auVar143,auVar336);
          auVar63 = vrcpps_avx(ZEXT1632(auVar71));
          auVar71 = vfmsub213ps_fma(ZEXT1632(auVar71),auVar63,auVar336);
          auVar71 = vfnmadd132ps_fma(ZEXT1632(auVar71),auVar63,auVar63);
          auVar71 = vfnmadd213ps_fma(ZEXT1632(auVar71),auVar236,auVar332);
          auVar68 = ZEXT1664(auVar71);
          goto LAB_002ae39f;
        case 6:
          uVar2 = **(undefined4 **)(&this->field_0xe8 + (long)p_Var12);
          auVar97._4_4_ = uVar2;
          auVar97._0_4_ = uVar2;
          auVar97._8_4_ = uVar2;
          auVar97._12_4_ = uVar2;
          auVar97._16_4_ = uVar2;
          auVar97._20_4_ = uVar2;
          auVar97._24_4_ = uVar2;
          auVar97._28_4_ = uVar2;
          uVar2 = (*(undefined4 **)(&this->field_0xe8 + (long)p_Var12))[1];
          auVar147._4_4_ = uVar2;
          auVar147._0_4_ = uVar2;
          auVar147._8_4_ = uVar2;
          auVar147._12_4_ = uVar2;
          auVar147._16_4_ = uVar2;
          auVar147._20_4_ = uVar2;
          auVar147._24_4_ = uVar2;
          auVar147._28_4_ = uVar2;
          auVar71 = vfmadd231ps_fma(auVar147,auVar58,auVar97);
          auVar63 = vmaxps_avx(ZEXT1632(auVar71),ZEXT832(0) << 0x20);
          auVar148._8_4_ = 0x3f800000;
          auVar148._0_8_ = 0x3f8000003f800000;
          auVar148._12_4_ = 0x3f800000;
          auVar148._16_4_ = 0x3f800000;
          auVar148._20_4_ = 0x3f800000;
          auVar148._24_4_ = 0x3f800000;
          auVar148._28_4_ = 0x3f800000;
          auVar63 = vminps_avx(auVar63,auVar148);
          auVar68 = ZEXT3264(auVar63);
LAB_002ae39f:
          auVar356._0_4_ = auVar68._0_4_ * fVar48;
          auVar356._4_4_ = auVar68._4_4_ * fVar69;
          auVar356._8_4_ = auVar68._8_4_ * auVar58._8_4_;
          auVar356._12_4_ = auVar68._12_4_ * auVar58._12_4_;
          auVar356._16_4_ = auVar68._16_4_ * auVar58._16_4_;
          auVar356._20_4_ = auVar68._20_4_ * auVar58._20_4_;
          auVar356._28_36_ = auVar68._28_36_;
          auVar356._24_4_ = auVar68._24_4_ * auVar58._24_4_;
          auVar63 = auVar356._0_32_;
        }
switchD_002adf3a_caseD_1:
        *(undefined1 (*) [32])((long)top_blob->data + uVar28 * 0x20) = auVar63;
      }
    }
    iVar27 = 0;
  }
  if (piStack_310 != (int *)0x0) {
    LOCK();
    *piStack_310 = *piStack_310 + -1;
    UNLOCK();
    if (*piStack_310 == 0) {
      if (local_2f8 == (Allocator *)0x0) {
        free(local_318);
      }
      else {
        (*local_2f8->_vptr_Allocator[3])();
      }
    }
  }
  return iVar27;
}

Assistant:

int InnerProduct_x86_fma::forward_fp16s(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    const int num_input = weight_data_size / num_output;

    if (bottom_blob.dims == 2 && bottom_blob.w == num_input)
    {
        // gemm
        int h = bottom_blob.h;
        size_t elemsize = bottom_blob.elemsize;
        int elempack = bottom_blob.elempack;

        top_blob.create(num_output, h, elemsize, elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        innerproduct_gemm_fp16s_sse(bottom_blob, top_blob, weight_data_tm, bias_data, activation_type, activation_params, opt);

        return 0;
    }

    // flatten
    Mat bottom_blob_flattened = bottom_blob;
    if (bottom_blob.dims != 1)
    {
        Option opt_flatten = opt;
        opt_flatten.blob_allocator = opt.workspace_allocator;

        flatten->forward(bottom_blob, bottom_blob_flattened, opt_flatten);
    }

    size_t elemsize = bottom_blob_flattened.elemsize;
    int elempack = bottom_blob_flattened.elempack;

    int out_elempack = 1;
    if (opt.use_packing_layout)
    {
#if __AVX512F__
        out_elempack = num_output % 16 == 0 ? 16 : num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#endif
    }
    size_t out_elemsize = elemsize / elempack * out_elempack;

    top_blob.create(num_output / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    innerproduct_fp16s_sse(bottom_blob_flattened, top_blob, weight_data_tm, bias_data, activation_type, activation_params, opt);

    return 0;
}